

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void custom_seqnum_test(bool multi_kv)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar3;
  fdb_kvs_handle **ppfVar4;
  fdb_status fVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  fdb_file_handle **ppfVar10;
  btree *pbVar11;
  size_t sVar12;
  fdb_doc *pfVar13;
  fdb_kvs_handle **ppfVar14;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_handle *pfVar16;
  btree_kv_ops *doc_00;
  fdb_kvs_handle *handle;
  fdb_config *pfVar17;
  fdb_doc **ppfVar18;
  fdb_doc *pfVar19;
  char *pcVar20;
  uint uVar21;
  char *pcVar22;
  fdb_encryption_key *pfVar23;
  undefined7 in_register_00000039;
  char *unaff_R12;
  long lVar24;
  code *unaff_R13;
  char *unaff_R14;
  ulong uVar25;
  fdb_doc **doc_01;
  fdb_iterator **unaff_R15;
  btree_kv_ops *ptr_fhandle;
  btree_kv_ops *__s2;
  char *pcVar26;
  fdb_kvs_handle **ppfVar27;
  bool bVar28;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char keybuf [256];
  fdb_doc real_doc;
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_1e058;
  fdb_file_handle *pfStack_1e050;
  void *pvStack_1e048;
  size_t asStack_1e040 [3];
  undefined4 uStack_1e028;
  undefined4 uStack_1e024;
  undefined4 uStack_1e020;
  undefined4 uStack_1e01c;
  undefined4 uStack_1e018;
  fdb_kvs_config fStack_1e010;
  timeval tStack_1dff8;
  fdb_config fStack_1dfe8;
  char acStack_1def0 [256];
  char acStack_1ddf0 [256];
  char acStack_1dcf0 [264];
  fdb_config *pfStack_1dbe8;
  fdb_kvs_handle **ppfStack_1dbe0;
  fdb_kvs_handle *pfStack_1dbd8;
  fdb_kvs_handle **ppfStack_1dbd0;
  fdb_kvs_handle *pfStack_1dbc8;
  code *pcStack_1dbc0;
  fdb_kvs_handle *pfStack_1dba8;
  fdb_file_handle *pfStack_1dba0;
  fdb_kvs_handle *pfStack_1db98;
  fdb_kvs_handle *pfStack_1db90;
  fdb_kvs_config fStack_1db88;
  timeval tStack_1db70;
  fdb_config fStack_1db60;
  fdb_kvs_handle *apfStack_1da68 [32];
  fdb_config fStack_1d968;
  fdb_kvs_handle **ppfStack_1d860;
  fdb_kvs_handle **ppfStack_1d858;
  fdb_kvs_handle **ppfStack_1d850;
  fdb_kvs_handle *pfStack_1d848;
  fdb_kvs_handle *pfStack_1d838;
  fdb_kvs_handle *pfStack_1d830;
  fdb_kvs_handle **ppfStack_1d828;
  fdb_kvs_handle *pfStack_1d820;
  fdb_kvs_config fStack_1d818;
  undefined1 auStack_1d800 [128];
  fdb_kvs_handle *apfStack_1d780 [33];
  fdb_config fStack_1d678;
  fdb_kvs_handle *apfStack_1d580 [32];
  fdb_kvs_handle *apfStack_1d480 [32];
  fdb_kvs_handle fStack_1d380;
  undefined8 auStack_1cf80 [896];
  fdb_kvs_handle *apfStack_1b380 [1025];
  fdb_doc **ppfStack_19378;
  char *pcStack_19370;
  long lStack_19368;
  fdb_doc *pfStack_19360;
  fdb_doc **ppfStack_19358;
  fdb_doc *pfStack_19350;
  fdb_doc *pfStack_19338;
  fdb_file_handle *pfStack_19330;
  long lStack_19328;
  fdb_kvs_handle *pfStack_19320;
  long lStack_19318;
  long lStack_19310;
  fdb_doc **ppfStack_19308;
  long lStack_19300;
  fdb_doc **ppfStack_192f8;
  size_t sStack_192f0;
  timeval tStack_192e8;
  fdb_kvs_config fStack_192d8;
  fdb_file_info fStack_192c0;
  fdb_doc afStack_19278 [3];
  char acStack_19178 [264];
  fdb_config fStack_19070;
  char acStack_18f78 [256];
  fdb_doc *apfStack_18e78 [2999];
  size_t sStack_130c0;
  size_t asStack_130b8 [1023];
  undefined1 auStack_110b9 [57225];
  fdb_doc **ppfStack_3130;
  fdb_config *pfStack_3128;
  fdb_file_handle **ppfStack_3120;
  ulong uStack_3118;
  fdb_kvs_handle **ppfStack_3110;
  fdb_kvs_handle **ppfStack_3108;
  fdb_doc *pfStack_30f0;
  fdb_kvs_handle *pfStack_30e8;
  undefined1 auStack_30e0 [24];
  fdb_file_handle *pfStack_30c8;
  fdb_kvs_handle *pfStack_30c0;
  fdb_kvs_config fStack_30b8;
  fdb_doc *apfStack_30a0 [31];
  timeval tStack_2fa8;
  fdb_config fStack_2f98;
  char acStack_2ea0 [256];
  fdb_file_handle *apfStack_2da0 [32];
  char acStack_2ca0 [264];
  fdb_kvs_handle **ppfStack_2b98;
  char *pcStack_2b90;
  char *pcStack_2b88;
  ulong uStack_2b80;
  undefined8 uStack_2b78;
  code *pcStack_2b70;
  fdb_file_handle *pfStack_2b68;
  fdb_kvs_handle *pfStack_2b60;
  char acStack_2b58 [32];
  fdb_kvs_config fStack_2b38;
  timeval tStack_2b20;
  fdb_file_info afStack_2b10 [3];
  fdb_config fStack_2a18;
  fdb_config *pfStack_2920;
  fdb_kvs_handle **ppfStack_2918;
  fdb_kvs_handle *pfStack_2910;
  fdb_doc *pfStack_2908;
  fdb_kvs_handle *pfStack_2900;
  fdb_encryption_key *pfStack_28f8;
  fdb_kvs_handle *pfStack_28e8;
  fdb_file_handle *pfStack_28e0;
  undefined1 auStack_28d8 [8];
  undefined1 auStack_28d0 [48];
  fdb_kvs_handle *apfStack_28a0 [32];
  fdb_doc afStack_27a0 [3];
  fdb_config fStack_26a0;
  ulong uStack_25a8;
  fdb_kvs_handle **ppfStack_25a0;
  fdb_kvs_handle *pfStack_2598;
  fdb_doc *pfStack_2590;
  fdb_kvs_handle *pfStack_2588;
  fdb_encryption_key *pfStack_2580;
  fdb_doc *pfStack_2570;
  fdb_kvs_handle *pfStack_2568;
  fdb_kvs_handle *pfStack_2560;
  fdb_file_handle *pfStack_2558;
  fdb_file_handle *pfStack_2550;
  fdb_doc *apfStack_2548 [11];
  fdb_kvs_config fStack_24f0;
  timeval tStack_24d8;
  fdb_kvs_handle fStack_24c8;
  fdb_config fStack_21c8;
  fdb_kvs_config *pfStack_20d0;
  fdb_file_handle **ppfStack_20c8;
  fdb_file_handle **ppfStack_20c0;
  fdb_kvs_handle **ppfStack_20b8;
  char *pcStack_20b0;
  fdb_doc *pfStack_20a8;
  fdb_file_handle *pfStack_2090;
  fdb_file_handle *pfStack_2088;
  fdb_kvs_handle *pfStack_2080;
  fdb_kvs_handle *pfStack_2078;
  timeval tStack_2070;
  fdb_doc *apfStack_2060 [31];
  fdb_kvs_config fStack_1f68;
  char acStack_1f50 [264];
  fdb_config fStack_1e48;
  char acStack_1d50 [256];
  char acStack_1c50 [264];
  fdb_kvs_handle *pfStack_1b48;
  fdb_kvs_handle *pfStack_1b40;
  fdb_kvs_handle *pfStack_1b38;
  fdb_kvs_handle *pfStack_1b30;
  fdb_kvs_handle **ppfStack_1b28;
  fdb_doc *pfStack_1b20;
  fdb_kvs_handle *pfStack_1b10;
  fdb_kvs_handle *pfStack_1b08;
  undefined1 auStack_1b00 [32];
  undefined1 auStack_1ae0 [280];
  fdb_doc afStack_19c8 [3];
  fdb_config afStack_18c0 [2];
  fdb_kvs_handle *pfStack_16c0;
  fdb_kvs_handle *pfStack_16b8;
  fdb_kvs_handle *pfStack_16b0;
  fdb_doc *pfStack_16a8;
  btree *pbStack_16a0;
  fdb_doc *pfStack_1698;
  fdb_doc *pfStack_1688;
  fdb_kvs_handle *pfStack_1680;
  fdb_file_handle *pfStack_1678;
  undefined1 auStack_1670 [88];
  timeval tStack_1618;
  fdb_doc afStack_1608 [3];
  fdb_doc afStack_14f0 [3];
  char acStack_13f0 [256];
  fdb_config fStack_12f0;
  btree_kv_ops *pbStack_11f8;
  fdb_kvs_handle *pfStack_11f0;
  fdb_kvs_handle *pfStack_11e8;
  btree *pbStack_11e0;
  fdb_doc *pfStack_11d8;
  fdb_doc *pfStack_11d0;
  undefined1 auStack_11c0 [16];
  undefined1 auStack_11b0 [16];
  timeval tStack_11a0;
  undefined1 auStack_1190 [280];
  fdb_doc afStack_1078 [5];
  size_t *psStack_ee8;
  btree abStack_d58 [4];
  char acStack_c58 [256];
  fdb_config fStack_b58;
  fdb_kvs_handle **ppfStack_a60;
  fdb_kvs_handle *pfStack_a58;
  fdb_kvs_handle *pfStack_a50;
  btree *pbStack_a48;
  fdb_file_handle **ppfStack_a40;
  fdb_doc *pfStack_a38;
  fdb_kvs_handle *pfStack_a28;
  undefined1 auStack_a20 [56];
  size_t *psStack_9e8;
  undefined1 auStack_9b8 [40];
  undefined8 uStack_990;
  void *pvStack_988;
  undefined8 uStack_980;
  undefined8 uStack_978;
  ulong uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined1 uStack_950;
  undefined1 auStack_890 [520];
  fdb_config fStack_688;
  char acStack_590 [264];
  fdb_kvs_handle *pfStack_488;
  fdb_kvs_handle *pfStack_480;
  fdb_kvs_handle *pfStack_478;
  fdb_kvs_handle *pfStack_470;
  fdb_iterator **ppfStack_468;
  fdb_doc *pfStack_460;
  fdb_doc *local_440;
  fdb_file_handle *local_438;
  int local_42c;
  fdb_iterator *local_428;
  undefined8 uStack_420;
  fdb_kvs_handle *local_418 [4];
  ulong local_3f8;
  undefined1 local_3f0 [40];
  undefined1 local_3c8 [80];
  undefined1 local_378 [512];
  fdb_doc local_178;
  fdb_custom_cmp_variable local_120;
  void *local_118;
  undefined1 local_108;
  undefined4 local_104;
  undefined1 local_f9;
  undefined1 local_e8;
  
  pcVar22 = (char *)(CONCAT71(in_register_00000039,multi_kv) & 0xffffffff);
  pfStack_460 = (fdb_doc *)0x115a1e;
  gettimeofday((timeval *)(local_3f0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_460 = (fdb_doc *)0x115a23;
  memleak_start();
  local_440 = (fdb_doc *)(local_378 + 0x200);
  local_178.seqnum = 0;
  local_178.deleted = false;
  local_178._73_3_ = 0;
  local_178.flags = 0;
  local_178.keylen = 0;
  local_178.metalen = 0;
  local_178.bodylen = 0;
  local_178.size_ondisk = 0;
  local_178.offset = 0;
  local_178.meta = (void *)0x0;
  local_178.key = local_378 + 0x100;
  local_178.body = local_378;
  pfStack_460 = (fdb_doc *)0x115a6a;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar16 = (fdb_kvs_handle *)&stack0xfffffffffffffed8;
  pfStack_460 = (fdb_doc *)0x115a7a;
  fdb_get_default_config();
  pfStack_460 = (fdb_doc *)0x115a84;
  fdb_get_default_kvs_config();
  local_120 = (fdb_custom_cmp_variable)0x0;
  local_118 = (void *)0x400;
  local_104 = 1;
  local_108 = 1;
  local_f9 = 0;
  local_e8 = SUB81(pcVar22,0);
  pfStack_460 = (fdb_doc *)0x115abb;
  fdb_open(&local_438,"./dummy1",(fdb_config *)pfVar16);
  local_42c = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_42c != 0) {
    unaff_R14 = (char *)0x3;
    pfVar16 = (fdb_kvs_handle *)0x18;
    unaff_R15 = &local_428;
    unaff_R12 = local_3f0;
    unaff_R13 = logCallbackFunc;
    pcVar22 = "custom_seqnum_test";
    do {
      pfStack_460 = (fdb_doc *)0x115afe;
      sprintf((char *)unaff_R15,"kv%d",(ulong)unaff_R14 & 0xffffffff);
      pfStack_460 = (fdb_doc *)0x115b16;
      fVar5 = fdb_kvs_open(local_438,
                           (fdb_kvs_handle **)
                           (&(pfVar16->kvs_config).create_if_missing + (long)local_418),
                           (char *)unaff_R15,(fdb_kvs_config *)unaff_R12);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00115f48;
      pfStack_460 = (fdb_doc *)0x115b2e;
      fVar5 = fdb_set_log_callback
                        ((fdb_kvs_handle *)
                         (&uStack_420)[(long)&(((fdb_kvs_handle *)unaff_R14)->kvs_config).field_0x1]
                         ,logCallbackFunc,"custom_seqnum_test");
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00115f43;
      pfVar16 = (fdb_kvs_handle *)&pfVar16[-1].bub_ctx.handle;
      bVar28 = (fdb_kvs_handle *)unaff_R14 != (fdb_kvs_handle *)0x0;
      unaff_R14 = (char *)((long)&(((fdb_kvs_handle *)((long)unaff_R14 + -0x208))->bub_ctx).handle +
                          7);
    } while (bVar28);
    pfVar15 = (fdb_kvs_handle *)0x4;
LAB_00115b88:
    unaff_R15 = (fdb_iterator **)(local_378 + 0x100);
    unaff_R12 = "body%d";
    pcVar22 = (char *)0x0;
    do {
      pfStack_460 = (fdb_doc *)0x115bbb;
      sprintf((char *)unaff_R15,"key%d",(ulong)pcVar22 & 0xffffffff);
      pfStack_460 = (fdb_doc *)0x115bca;
      sprintf((char *)local_378,"body%d",(ulong)pcVar22 & 0xffffffff);
      pfVar16 = (fdb_kvs_handle *)(local_3c8 + (long)pcVar22 * 8);
      pfStack_460 = (fdb_doc *)0x115bdd;
      sVar7 = strlen((char *)unaff_R15);
      pfStack_460 = (fdb_doc *)0x115be9;
      sVar8 = strlen((char *)local_378);
      pfStack_460 = (fdb_doc *)0x115c06;
      fdb_doc_create((fdb_doc **)pfVar16,unaff_R15,sVar7 + 1,(void *)0x0,0,
                     (fdb_kvs_handle *)local_378,sVar8 + 1);
      unaff_R14 = (char *)pfVar15;
      while (0 < (long)unaff_R14) {
        puVar2 = &uStack_420 + (long)unaff_R14;
        unaff_R14 = (char *)((long)&(((fdb_kvs_handle *)((long)unaff_R14 + -0x208))->bub_ctx).handle
                            + 7);
        pfStack_460 = (fdb_doc *)0x115c20;
        fVar5 = fdb_set((fdb_kvs_handle *)*puVar2,*(fdb_doc **)&pfVar16->kvs_config);
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_460 = (fdb_doc *)0x115f1e;
          custom_seqnum_test();
          unaff_R13 = (code *)local_378;
          goto LAB_00115f1e;
        }
      }
      pcVar22 = (char *)((long)&((fdb_doc *)pcVar22)->keylen + 1);
    } while ((fdb_doc *)pcVar22 != (fdb_doc *)0x5);
    unaff_R14 = (char *)0x5;
    pcVar22 = local_378;
    do {
      pcVar26 = local_378 + 0x100;
      pfStack_460 = (fdb_doc *)0x115c60;
      sprintf(pcVar26,"key%d",(ulong)unaff_R14 & 0xffffffff);
      pfStack_460 = (fdb_doc *)0x115c74;
      sprintf(pcVar22,"body%d",(ulong)unaff_R14 & 0xffffffff);
      pfVar16 = (fdb_kvs_handle *)(local_3c8 + (long)unaff_R14 * 8);
      pfStack_460 = (fdb_doc *)0x115c87;
      sVar7 = strlen(pcVar26);
      pfStack_460 = (fdb_doc *)0x115c93;
      sVar8 = strlen(pcVar22);
      pfStack_460 = (fdb_doc *)0x115cb0;
      fdb_doc_create((fdb_doc **)pfVar16,pcVar26,sVar7 + 1,(void *)0x0,0,pcVar22,sVar8 + 1);
      unaff_R15 = (fdb_iterator **)((long)unaff_R14 * 2 + 2);
      unaff_R13 = (code *)pfVar15;
      while (0 < (long)unaff_R13) {
        unaff_R12 = (char *)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle
                            + 7);
        pfStack_460 = (fdb_doc *)0x115cd1;
        fdb_doc_set_seqnum(*(fdb_doc **)&pfVar16->kvs_config,(fdb_seqnum_t)unaff_R15);
        pfStack_460 = (fdb_doc *)0x115cde;
        fVar5 = fdb_set((fdb_kvs_handle *)(&uStack_420)[(long)unaff_R13],
                        *(fdb_doc **)&pfVar16->kvs_config);
        unaff_R13 = (code *)unaff_R12;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00115f1e;
      }
      unaff_R14 = &(((fdb_kvs_handle *)unaff_R14)->kvs_config).field_0x1;
    } while (unaff_R14 != (undefined1 *)0xa);
    uVar9 = (ulong)((int)pfVar15 - 1);
    uVar25 = uVar9;
    do {
      local_3f8 = uVar25;
      pfStack_460 = (fdb_doc *)0x115d28;
      fdb_iterator_init((fdb_kvs_handle *)(&uStack_420)[uVar25 + 1],&local_428,(void *)0x0,0,
                        (void *)0x0,0,0);
      unaff_R12 = (char *)0x2;
      unaff_R14 = (char *)(fdb_kvs_handle *)0x0;
      pfVar13 = (fdb_doc *)pcVar22;
      do {
        pfStack_460 = (fdb_doc *)0x115d42;
        fVar5 = fdb_iterator_get(local_428,&local_440);
        pcVar22 = (char *)local_440;
        pfVar16 = (fdb_kvs_handle *)unaff_R14;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00115f23;
        pfVar16 = (fdb_kvs_handle *)local_440->key;
        unaff_R15 = *(fdb_iterator ***)(local_3c8 + (long)unaff_R14 * 8);
        unaff_R13 = (code *)unaff_R15[4];
        pfStack_460 = (fdb_doc *)0x115d6e;
        iVar6 = bcmp(pfVar16,unaff_R13,local_440->keylen);
        if (iVar6 != 0) goto LAB_00115f28;
        pfVar16 = (fdb_kvs_handle *)((fdb_doc *)pcVar22)->body;
        unaff_R13 = (code *)unaff_R15[8];
        pfStack_460 = (fdb_doc *)0x115d8d;
        iVar6 = bcmp(pfVar16,unaff_R13,((fdb_doc *)pcVar22)->bodylen);
        if (iVar6 != 0) goto LAB_00115f33;
        puVar1 = &(((fdb_kvs_handle *)unaff_R14)->kvs_config).field_0x1;
        if (unaff_R14 < (fdb_kvs_handle *)0x5) {
          if ((fdb_kvs_handle *)puVar1 != (fdb_kvs_handle *)((fdb_doc *)pcVar22)->seqnum) {
            pfStack_460 = (fdb_doc *)0x115db5;
            custom_seqnum_test();
          }
        }
        else if ((fdb_kvs_handle *)unaff_R12 != (fdb_kvs_handle *)((fdb_doc *)pcVar22)->seqnum) {
          pfStack_460 = (fdb_doc *)0x115de2;
          custom_seqnum_test();
        }
        pfStack_460 = (fdb_doc *)0x115dc6;
        fVar5 = fdb_iterator_next(local_428);
        unaff_R12 = &(((fdb_kvs_handle *)unaff_R12)->kvs_config).field_0x2;
        unaff_R14 = puVar1;
        pfVar13 = (fdb_doc *)pcVar22;
      } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
      pfStack_460 = (fdb_doc *)0x115dee;
      fdb_iterator_close(local_428);
      pfStack_460 = (fdb_doc *)0x115dfd;
      fdb_commit(local_438,'\x01');
      uVar25 = local_3f8 - 1;
    } while (0 < (long)local_3f8);
    pfStack_460 = (fdb_doc *)0x115e20;
    fdb_compact(local_438,"./dummy2");
    pfVar16 = (fdb_kvs_handle *)0x5;
    unaff_R14 = "key%d";
    unaff_R15 = (fdb_iterator **)(local_378 + 0x100);
    do {
      pfStack_460 = (fdb_doc *)0x115e48;
      sprintf((char *)unaff_R15,"key%d",(ulong)pfVar16 & 0xffffffff);
      unaff_R12 = (char *)((long)pfVar16 * 2 + 2);
      unaff_R13 = (code *)(uVar9 + 1);
      do {
        local_440->seqnum = (fdb_seqnum_t)unaff_R12;
        pfStack_460 = (fdb_doc *)0x115e68;
        fVar5 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_420)[(long)unaff_R13],local_440);
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00115f3e;
        pfVar15 = (fdb_kvs_handle *)
                  ((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 7);
        bVar28 = 0 < (long)unaff_R13;
        unaff_R13 = (code *)pfVar15;
      } while (pfVar15 != (fdb_kvs_handle *)0x0 && bVar28);
      pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
      if (pfVar16 == (fdb_kvs_handle *)0xa) {
        pfStack_460 = (fdb_doc *)0x115e88;
        fdb_close(local_438);
        lVar24 = 0;
        do {
          pfStack_460 = (fdb_doc *)0x115e97;
          fdb_doc_free(*(fdb_doc **)(local_3c8 + lVar24 * 8));
          lVar24 = lVar24 + 1;
        } while (lVar24 != 10);
        pfStack_460 = (fdb_doc *)0x115ea5;
        fdb_shutdown();
        pfStack_460 = (fdb_doc *)0x115eaa;
        memleak_end();
        pcVar22 = "single kv instance";
        if ((char)local_42c != '\0') {
          pcVar22 = "multiple kv instances";
        }
        pfStack_460 = (fdb_doc *)0x115eda;
        sprintf(local_378,"Custom sequence number test %s",pcVar22);
        pcVar22 = "%s PASSED\n";
        if (custom_seqnum_test(bool)::__test_pass != '\0') {
          pcVar22 = "%s FAILED\n";
        }
        pfStack_460 = (fdb_doc *)0x115f07;
        fprintf(_stderr,pcVar22,local_378);
        return;
      }
    } while( true );
  }
  pfStack_460 = (fdb_doc *)0x115b5b;
  fVar5 = fdb_kvs_open_default(local_438,local_418,(fdb_kvs_config *)local_3f0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00115f4d;
  pfStack_460 = (fdb_doc *)0x115b7b;
  fVar5 = fdb_set_log_callback(local_418[0],logCallbackFunc,"custom_seqnum_test");
  pfVar15 = (fdb_kvs_handle *)0x1;
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00115b88;
  goto LAB_00115f52;
LAB_00116498:
  pfStack_a38 = (fdb_doc *)0x1164a3;
  doc_compression_test();
  unaff_R13 = (code *)pfVar16;
LAB_001164a3:
  pfVar16 = (fdb_kvs_handle *)unaff_R13;
  pfStack_a38 = (fdb_doc *)0x1164a8;
  doc_compression_test();
LAB_001164a8:
  pfStack_a38 = (fdb_doc *)0x1164b3;
  doc_compression_test();
  unaff_R13 = (code *)pfVar16;
LAB_001164b3:
  ppfVar14 = &pfStack_a28;
  pfStack_a38 = (fdb_doc *)0x1164b8;
  doc_compression_test();
  goto LAB_001164b8;
LAB_00116f9c:
  pfStack_1698 = (fdb_doc *)0x116fa1;
  purge_logically_deleted_doc_test();
  pfVar19 = (fdb_doc *)pcVar22;
LAB_00116fa1:
  pfStack_1698 = (fdb_doc *)0x116fa6;
  purge_logically_deleted_doc_test();
LAB_00116fa6:
  pfStack_1698 = (fdb_doc *)0x116fab;
  purge_logically_deleted_doc_test();
LAB_00116fab:
  pfStack_1698 = (fdb_doc *)0x116fb6;
  purge_logically_deleted_doc_test();
LAB_00116fb6:
  pfStack_1698 = (fdb_doc *)0x116fbb;
  purge_logically_deleted_doc_test();
LAB_00116fbb:
  pfStack_1698 = (fdb_doc *)0x116fc6;
  purge_logically_deleted_doc_test();
  pfVar16 = pfVar15;
  pcVar22 = (char *)pfVar19;
LAB_00116fc6:
  pfStack_1698 = (fdb_doc *)0x116fcb;
  purge_logically_deleted_doc_test();
  goto LAB_00116fcb;
LAB_001172d0:
  pfStack_1b20 = (fdb_doc *)0x1172e0;
  api_wrapper_test();
LAB_001172e0:
  pfStack_1b20 = (fdb_doc *)0x1172e5;
  api_wrapper_test();
LAB_001172e5:
  pfVar15 = (fdb_kvs_handle *)(auStack_1ae0 + 0x18);
  pfStack_1b20 = (fdb_doc *)0x1172ea;
  api_wrapper_test();
  goto LAB_001172ea;
LAB_00117e03:
  pfStack_2580 = (fdb_encryption_key *)0x117e13;
  flush_before_commit_multi_writers_test();
  pfVar19 = pfVar13;
  goto LAB_00117e13;
LAB_00118159:
  pfStack_28f8 = (fdb_encryption_key *)0x118166;
  auto_commit_test();
  pfVar15 = (fdb_kvs_handle *)pcVar22;
LAB_00118166:
  pcVar22 = (char *)pfVar15;
  pfStack_28f8 = (fdb_encryption_key *)0x11816b;
  auto_commit_test();
LAB_0011816b:
  pfStack_28f8 = (fdb_encryption_key *)0x118178;
  auto_commit_test();
  pfVar15 = (fdb_kvs_handle *)pcVar22;
LAB_00118178:
  pfVar13 = afStack_27a0;
  ppfVar14 = apfStack_28a0;
  pfStack_28f8 = (fdb_encryption_key *)0x11817d;
  auto_commit_test();
  goto LAB_0011817d;
LAB_0011943e:
  pfStack_1d848 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1d848 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1d848 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1d848 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar16 = (fdb_kvs_handle *)pcVar26;
LAB_00119452:
  pfStack_1d848 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1d848 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1d848 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1d848 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1d848 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
LAB_00115f1e:
  pfStack_460 = (fdb_doc *)0x115f23;
  custom_seqnum_test();
  pfVar13 = (fdb_doc *)pcVar22;
LAB_00115f23:
  pcVar22 = (char *)pfVar13;
  pfStack_460 = (fdb_doc *)0x115f28;
  custom_seqnum_test();
LAB_00115f28:
  pfStack_460 = (fdb_doc *)0x115f33;
  custom_seqnum_test();
LAB_00115f33:
  pfStack_460 = (fdb_doc *)0x115f3e;
  custom_seqnum_test();
LAB_00115f3e:
  pfStack_460 = (fdb_doc *)0x115f43;
  custom_seqnum_test();
LAB_00115f43:
  pfStack_460 = (fdb_doc *)0x115f48;
  custom_seqnum_test();
LAB_00115f48:
  pfStack_460 = (fdb_doc *)0x115f4d;
  custom_seqnum_test();
LAB_00115f4d:
  pfStack_460 = (fdb_doc *)0x115f52;
  custom_seqnum_test();
LAB_00115f52:
  pfStack_460 = (fdb_doc *)doc_compression_test;
  custom_seqnum_test();
  pfStack_a38 = (fdb_doc *)0x115f7a;
  pfStack_488 = pfVar16;
  pfStack_480 = (fdb_kvs_handle *)unaff_R12;
  pfStack_478 = (fdb_kvs_handle *)unaff_R13;
  pfStack_470 = (fdb_kvs_handle *)unaff_R14;
  ppfStack_468 = unaff_R15;
  pfStack_460 = (fdb_doc *)pcVar22;
  gettimeofday((timeval *)(auStack_9b8 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_a38 = (fdb_doc *)0x115f7f;
  memleak_start();
  pfStack_a28 = (fdb_kvs_handle *)0x0;
  pfStack_a38 = (fdb_doc *)0x115f90;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_a38 = (fdb_doc *)0x115fa0;
  fdb_get_default_config();
  pbVar11 = (btree *)auStack_9b8;
  pfStack_a38 = (fdb_doc *)0x115fad;
  fdb_get_default_kvs_config();
  fStack_688.buffercache_size = 0;
  fStack_688.wal_threshold = 0x400;
  fStack_688.flags = 1;
  fStack_688.compress_document_body = true;
  fStack_688.compaction_threshold = '\0';
  fStack_688.purging_interval = 1;
  ppfVar10 = (fdb_file_handle **)(auStack_a20 + 8);
  pfStack_a38 = (fdb_doc *)0x115fe3;
  fdb_open(ppfVar10,"./dummy1",&fStack_688);
  ppfVar14 = (fdb_kvs_handle **)auStack_a20;
  pfStack_a38 = (fdb_doc *)0x115ff6;
  fdb_kvs_open_default((fdb_file_handle *)auStack_a20._8_8_,ppfVar14,(fdb_kvs_config *)pbVar11);
  pfStack_a38 = (fdb_doc *)0x11600c;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_a20._0_8_,logCallbackFunc,"doc_compression_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    uStack_980 = 0x6161616161616161;
    uStack_978 = 0x6161616161616161;
    uStack_990._0_2_ = 0x6161;
    uStack_990._2_6_ = 0x616161616161;
    pvStack_988 = (void *)0x6161616161616161;
    uStack_970 = uStack_970 & 0xffffffffffffff00;
    unaff_R13 = (code *)0x0;
    uVar25 = 0;
    do {
      pfStack_a38 = (fdb_doc *)0x116050;
      sprintf(acStack_590,"key%d",uVar25 & 0xffffffff);
      pfStack_a38 = (fdb_doc *)0x116069;
      sprintf(auStack_890 + 0x100,"meta%d",uVar25 & 0xffffffff);
      pfStack_a38 = (fdb_doc *)0x11608a;
      sprintf(auStack_890,"body%d_%s",uVar25 & 0xffffffff,&uStack_990);
      unaff_R12 = auStack_a20 + (long)unaff_R13 + 0x10;
      pfStack_a38 = (fdb_doc *)0x11609a;
      pcVar22 = (char *)strlen(acStack_590);
      pfStack_a38 = (fdb_doc *)0x1160ad;
      ppfVar10 = (fdb_file_handle **)strlen(auStack_890 + 0x100);
      pfStack_a38 = (fdb_doc *)0x1160bd;
      sVar7 = strlen(auStack_890);
      pfStack_a38 = (fdb_doc *)0x1160e2;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_590,(size_t)pcVar22,auStack_890 + 0x100,
                     (size_t)ppfVar10,auStack_890,sVar7);
      pfStack_a38 = (fdb_doc *)0x1160f1;
      fdb_set((fdb_kvs_handle *)auStack_a20._0_8_,*(fdb_doc **)(auStack_a20 + uVar25 * 8 + 0x10));
      uVar25 = uVar25 + 1;
      unaff_R13 = (code *)((long)unaff_R13 + 8);
    } while (uVar25 != 10);
    ppfVar14 = &pfStack_a28;
    pfStack_a38 = (fdb_doc *)0x11612e;
    fdb_doc_create((fdb_doc **)ppfVar14,(void *)psStack_9e8[4],*psStack_9e8,(void *)psStack_9e8[7],
                   psStack_9e8[1],(void *)0x0,0);
    pfStack_a38 = (fdb_doc *)0x11613b;
    fVar5 = fdb_del((fdb_kvs_handle *)auStack_a20._0_8_,(fdb_doc *)pfStack_a28);
    pbVar11 = (btree *)0xa;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001164bd;
    pfStack_a38 = (fdb_doc *)0x11614d;
    fdb_doc_free((fdb_doc *)pfStack_a28);
    pfStack_a28 = (fdb_kvs_handle *)0x0;
    ppfVar14 = (fdb_kvs_handle **)(auStack_a20 + 8);
    pfStack_a38 = (fdb_doc *)0x116165;
    fdb_commit((fdb_file_handle *)auStack_a20._8_8_,'\0');
    pbVar11 = (btree *)auStack_a20;
    pfStack_a38 = (fdb_doc *)0x116172;
    fdb_kvs_close((fdb_kvs_handle *)auStack_a20._0_8_);
    pfStack_a38 = (fdb_doc *)0x11617a;
    fdb_close((fdb_file_handle *)auStack_a20._8_8_);
    pfStack_a38 = (fdb_doc *)0x116191;
    fdb_open((fdb_file_handle **)ppfVar14,"./dummy1",&fStack_688);
    pfStack_a38 = (fdb_doc *)0x1161a1;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_a20._8_8_,(fdb_kvs_handle **)pbVar11,
               (fdb_kvs_config *)auStack_9b8);
    pfStack_a38 = (fdb_doc *)0x1161b7;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_a20._0_8_,logCallbackFunc,"doc_compression_test");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      uStack_960 = 0x6262626262626262;
      uStack_958 = 0x6262626262626262;
      uStack_970 = 0x6262626262626262;
      uStack_968 = 0x6262626262626262;
      uStack_980 = 0x6262626262626262;
      uStack_978 = 0x6262626262626262;
      uStack_990._0_2_ = 0x6262;
      uStack_990._2_6_ = 0x626262626262;
      pvStack_988 = (void *)0x6262626262626262;
      uStack_950 = 0;
      ppfVar10 = (fdb_file_handle **)(auStack_890 + 0x100);
      lVar24 = 0;
      pcVar22 = (char *)0x0;
      do {
        pfStack_a38 = (fdb_doc *)0x116209;
        sprintf((char *)ppfVar10,"newmeta%d",(ulong)pcVar22 & 0xffffffff);
        pfStack_a38 = (fdb_doc *)0x116224;
        sprintf((char *)auStack_890,"newbody%d_%s",(ulong)pcVar22 & 0xffffffff,&uStack_990);
        pfStack_a38 = (fdb_doc *)0x116234;
        pbVar11 = (btree *)strlen((char *)ppfVar10);
        pfStack_a38 = (fdb_doc *)0x11623f;
        sVar7 = strlen((char *)auStack_890);
        pfStack_a38 = (fdb_doc *)0x116253;
        fdb_doc_update((fdb_doc **)(auStack_a20 + lVar24 + 0x10),ppfVar10,(size_t)pbVar11,
                       (fdb_kvs_handle *)auStack_890,sVar7);
        pfStack_a38 = (fdb_doc *)0x116262;
        fdb_set((fdb_kvs_handle *)auStack_a20._0_8_,
                *(fdb_doc **)(auStack_a20 + (long)pcVar22 * 8 + 0x10));
        pcVar22 = (char *)((long)&((fdb_doc *)pcVar22)->keylen + 1);
        lVar24 = lVar24 + 8;
      } while ((fdb_doc *)pcVar22 == (fdb_doc *)0x1);
      unaff_R12 = (char *)0x0;
      pfStack_a38 = (fdb_doc *)0x11627e;
      fdb_commit((fdb_file_handle *)auStack_a20._8_8_,'\0');
      pfVar16 = (fdb_kvs_handle *)auStack_890;
      do {
        pfStack_a38 = (fdb_doc *)0x1162a7;
        fdb_doc_create((fdb_doc **)&pfStack_a28,
                       (void *)(*(size_t **)(auStack_a20 + (long)unaff_R12 * 8 + 0x10))[4],
                       **(size_t **)(auStack_a20 + (long)unaff_R12 * 8 + 0x10),(void *)0x0,0,
                       (void *)0x0,0);
        pfStack_a38 = (fdb_doc *)0x1162b6;
        fVar5 = fdb_get((fdb_kvs_handle *)auStack_a20._0_8_,(fdb_doc *)pfStack_a28);
        unaff_R13 = (code *)pfStack_a28;
        if ((fdb_kvs_handle *)unaff_R12 != (fdb_kvs_handle *)0x5) {
          if (fVar5 == FDB_RESULT_SUCCESS) {
            pbVar11 = pfStack_a28->staletree;
            pcVar22 = *(char **)(auStack_a20 + (long)unaff_R12 * 8 + 0x10);
            ppfVar10 = (fdb_file_handle **)((fdb_doc *)pcVar22)->meta;
            pfStack_a38 = (fdb_doc *)0x1162ef;
            iVar6 = bcmp(pbVar11,ppfVar10,(size_t)(pfStack_a28->kvs_config).custom_cmp);
            if (iVar6 == 0) {
              pbVar11 = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
              ppfVar10 = (fdb_file_handle **)((fdb_doc *)pcVar22)->body;
              pfStack_a38 = (fdb_doc *)0x11630e;
              iVar6 = bcmp(pbVar11,ppfVar10,
                           (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
              if (iVar6 == 0) goto LAB_00116316;
              pfStack_a38 = (fdb_doc *)0x116483;
              doc_compression_test();
              pfVar16 = (fdb_kvs_handle *)unaff_R13;
              goto LAB_00116483;
            }
          }
          else {
LAB_00116483:
            unaff_R13 = (code *)pfVar16;
            pfStack_a38 = (fdb_doc *)0x116488;
            doc_compression_test();
          }
          pfStack_a38 = (fdb_doc *)0x116493;
          doc_compression_test();
          pfVar16 = (fdb_kvs_handle *)unaff_R13;
LAB_00116493:
          pfStack_a38 = (fdb_doc *)0x116498;
          doc_compression_test();
          goto LAB_00116498;
        }
        unaff_R13 = (code *)pfVar16;
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116493;
LAB_00116316:
        pfStack_a38 = (fdb_doc *)0x116320;
        fdb_doc_free((fdb_doc *)pfStack_a28);
        pfStack_a28 = (fdb_kvs_handle *)0x0;
        unaff_R12 = &(((fdb_kvs_handle *)unaff_R12)->kvs_config).field_0x1;
        pfVar16 = (fdb_kvs_handle *)unaff_R13;
      } while (unaff_R12 != (undefined1 *)0xa);
      pfStack_a38 = (fdb_doc *)0x116347;
      fdb_compact((fdb_file_handle *)auStack_a20._8_8_,"./dummy2");
      unaff_R12 = (char *)0x0;
      do {
        pfStack_a38 = (fdb_doc *)0x116373;
        fdb_doc_create((fdb_doc **)&pfStack_a28,
                       (void *)(*(size_t **)(auStack_a20 + (long)unaff_R12 * 8 + 0x10))[4],
                       **(size_t **)(auStack_a20 + (long)unaff_R12 * 8 + 0x10),(void *)0x0,0,
                       (void *)0x0,0);
        pfStack_a38 = (fdb_doc *)0x116382;
        fVar5 = fdb_get((fdb_kvs_handle *)auStack_a20._0_8_,(fdb_doc *)pfStack_a28);
        pfVar16 = pfStack_a28;
        if ((fdb_kvs_handle *)unaff_R12 == (fdb_kvs_handle *)0x5) {
          pfVar16 = (fdb_kvs_handle *)unaff_R13;
          if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001164b3;
        }
        else {
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001164a3;
          pbVar11 = pfStack_a28->staletree;
          pcVar22 = *(char **)(auStack_a20 + (long)unaff_R12 * 8 + 0x10);
          ppfVar10 = (fdb_file_handle **)((fdb_doc *)pcVar22)->meta;
          pfStack_a38 = (fdb_doc *)0x1163bb;
          iVar6 = bcmp(pbVar11,ppfVar10,(size_t)(pfStack_a28->kvs_config).custom_cmp);
          if (iVar6 != 0) goto LAB_001164a8;
          pbVar11 = (pfVar16->field_6).seqtree;
          ppfVar10 = (fdb_file_handle **)((fdb_doc *)pcVar22)->body;
          pfStack_a38 = (fdb_doc *)0x1163da;
          iVar6 = bcmp(pbVar11,ppfVar10,(size_t)(pfVar16->kvs_config).custom_cmp_param);
          if (iVar6 != 0) goto LAB_00116498;
        }
        pfStack_a38 = (fdb_doc *)0x1163ec;
        fdb_doc_free((fdb_doc *)pfStack_a28);
        pfStack_a28 = (fdb_kvs_handle *)0x0;
        unaff_R12 = &(((fdb_kvs_handle *)unaff_R12)->kvs_config).field_0x1;
        unaff_R13 = (code *)pfVar16;
        if (unaff_R12 == (undefined1 *)0xa) {
          lVar24 = 0;
          do {
            pfStack_a38 = (fdb_doc *)0x11640e;
            fdb_doc_free(*(fdb_doc **)(auStack_a20 + lVar24 * 8 + 0x10));
            lVar24 = lVar24 + 1;
          } while (lVar24 != 10);
          pfStack_a38 = (fdb_doc *)0x116421;
          fdb_kvs_close((fdb_kvs_handle *)auStack_a20._0_8_);
          pfStack_a38 = (fdb_doc *)0x11642b;
          fdb_close((fdb_file_handle *)auStack_a20._8_8_);
          pfStack_a38 = (fdb_doc *)0x116430;
          fdb_shutdown();
          pfStack_a38 = (fdb_doc *)0x116435;
          memleak_end();
          pcVar22 = "%s PASSED\n";
          if (doc_compression_test()::__test_pass != '\0') {
            pcVar22 = "%s FAILED\n";
          }
          pfStack_a38 = (fdb_doc *)0x116466;
          fprintf(_stderr,pcVar22,"document compression test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_001164b8:
    pfStack_a38 = (fdb_doc *)0x1164bd;
    doc_compression_test();
LAB_001164bd:
    pfStack_a38 = (fdb_doc *)0x1164c2;
    doc_compression_test();
  }
  pfStack_a38 = (fdb_doc *)read_doc_by_offset_test;
  doc_compression_test();
  pfStack_11d0 = (fdb_doc *)0x1164e4;
  ppfStack_a60 = ppfVar14;
  pfStack_a58 = (fdb_kvs_handle *)unaff_R12;
  pfStack_a50 = (fdb_kvs_handle *)unaff_R13;
  pbStack_a48 = pbVar11;
  ppfStack_a40 = ppfVar10;
  pfStack_a38 = (fdb_doc *)pcVar22;
  gettimeofday(&tStack_11a0,(__timezone_ptr_t)0x0);
  pfStack_11d0 = (fdb_doc *)0x1164e9;
  memleak_start();
  pfStack_11d0 = (fdb_doc *)0x1164f5;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_11d0 = (fdb_doc *)0x116505;
  fdb_get_default_config();
  pbVar11 = (btree *)auStack_1190;
  pfStack_11d0 = (fdb_doc *)0x116512;
  fdb_get_default_kvs_config();
  fStack_b58.buffercache_size = 0;
  fStack_b58.wal_threshold = 0x400;
  fStack_b58.flags = 1;
  fStack_b58.purging_interval = 0xe10;
  fStack_b58.compaction_threshold = '\0';
  ptr_fhandle = (btree_kv_ops *)auStack_11b0;
  pfStack_11d0 = (fdb_doc *)0x11654b;
  fdb_open((fdb_file_handle **)ptr_fhandle,"./dummy1",&fStack_b58);
  doc_00 = (btree_kv_ops *)(auStack_11c0 + 8);
  pfStack_11d0 = (fdb_doc *)0x11655e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_11b0._0_8_,(fdb_kvs_handle **)doc_00,
             (fdb_kvs_config *)pbVar11);
  pfStack_11d0 = (fdb_doc *)0x116574;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11c0._8_8_,logCallbackFunc,"read_doc_by_offset_test")
  ;
  if (fVar5 == FDB_RESULT_SUCCESS) {
    lVar24 = 0;
    uVar25 = 0;
    do {
      pfStack_11d0 = (fdb_doc *)0x11659c;
      sprintf(acStack_c58,"key%d",uVar25 & 0xffffffff);
      pfStack_11d0 = (fdb_doc *)0x1165b4;
      sprintf((char *)abStack_d58,"meta%d",uVar25 & 0xffffffff);
      pfStack_11d0 = (fdb_doc *)0x1165c9;
      sprintf(auStack_1190 + 0x18,"body%d",uVar25 & 0xffffffff);
      pfStack_11d0 = (fdb_doc *)0x1165dc;
      sVar7 = strlen(acStack_c58);
      pfStack_11d0 = (fdb_doc *)0x1165ef;
      sVar8 = strlen((char *)abStack_d58);
      pfStack_11d0 = (fdb_doc *)0x1165fc;
      sVar12 = strlen(auStack_1190 + 0x18);
      pfStack_11d0 = (fdb_doc *)0x11661e;
      fdb_doc_create((fdb_doc **)((long)&afStack_1078[0].keylen + lVar24),acStack_c58,sVar7,
                     abStack_d58,sVar8,auStack_1190 + 0x18,sVar12);
      pfStack_11d0 = (fdb_doc *)0x116630;
      fdb_set((fdb_kvs_handle *)auStack_11c0._8_8_,(fdb_doc *)(&afStack_1078[0].keylen)[uVar25]);
      uVar25 = uVar25 + 1;
      lVar24 = lVar24 + 8;
    } while (uVar25 != 100);
    pfStack_11d0 = (fdb_doc *)0x11664d;
    fdb_commit((fdb_file_handle *)auStack_11b0._0_8_,'\0');
    pbVar11 = abStack_d58;
    unaff_R12 = auStack_1190 + 0x18;
    ptr_fhandle = (btree_kv_ops *)0x0;
    uVar25 = 0;
    do {
      pfStack_11d0 = (fdb_doc *)0x116674;
      sprintf((char *)pbVar11,"meta2%d",uVar25 & 0xffffffff);
      pfStack_11d0 = (fdb_doc *)0x116688;
      sprintf(unaff_R12,"body2%d",uVar25 & 0xffffffff);
      pcVar22 = (char *)((long)&afStack_1078[0].keylen + (long)ptr_fhandle);
      pfStack_11d0 = (fdb_doc *)0x11669b;
      sVar7 = strlen((char *)pbVar11);
      pfStack_11d0 = (fdb_doc *)0x1166a6;
      sVar8 = strlen(unaff_R12);
      pfStack_11d0 = (fdb_doc *)0x1166ba;
      fdb_doc_update((fdb_doc **)pcVar22,pbVar11,sVar7,unaff_R12,sVar8);
      pfStack_11d0 = (fdb_doc *)0x1166cc;
      fdb_set((fdb_kvs_handle *)auStack_11c0._8_8_,(fdb_doc *)(&afStack_1078[0].keylen)[uVar25]);
      uVar25 = uVar25 + 1;
      ptr_fhandle = (btree_kv_ops *)((long)ptr_fhandle + 8);
    } while (uVar25 != 0x32);
    doc_00 = (btree_kv_ops *)auStack_11c0;
    pfStack_11d0 = (fdb_doc *)0x116708;
    fdb_doc_create((fdb_doc **)doc_00,(void *)psStack_ee8[4],*psStack_ee8,(void *)psStack_ee8[7],
                   psStack_ee8[1],(void *)0x0,0);
    pfStack_11d0 = (fdb_doc *)0x116715;
    fVar5 = fdb_del((fdb_kvs_handle *)auStack_11c0._8_8_,(fdb_doc *)auStack_11c0._0_8_);
    unaff_R13 = (code *)0x32;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116a3e;
    doc_00 = (btree_kv_ops *)auStack_11c0;
    pfStack_11d0 = (fdb_doc *)0x11672a;
    fdb_doc_free((fdb_doc *)auStack_11c0._0_8_);
    pbVar11 = (btree *)0x0;
    auStack_11c0._0_8_ = (btree_kv_ops *)0x0;
    pfStack_11d0 = (fdb_doc *)0x11673c;
    fdb_commit((fdb_file_handle *)auStack_11b0._0_8_,'\0');
    pfStack_11d0 = (fdb_doc *)0x11675f;
    fdb_doc_create((fdb_doc **)doc_00,*(kvs_ops_stat **)(afStack_1078[0].seqnum + 0x20),
                   *(size_t *)(fdb_kvs_config *)afStack_1078[0].seqnum,(void *)0x0,0,(void *)0x0,0);
    pfStack_11d0 = (fdb_doc *)0x11676c;
    fVar5 = fdb_get_metaonly((fdb_kvs_handle *)auStack_11c0._8_8_,(fdb_doc *)auStack_11c0._0_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116a43;
    if (*(char *)(auStack_11c0._0_8_ + 0x48) != '\0') {
      pfStack_11d0 = (fdb_doc *)0x116789;
      read_doc_by_offset_test();
    }
    doc_00 = (btree_kv_ops *)auStack_11c0._0_8_;
    pbVar11 = *(btree **)(auStack_11c0._0_8_ + 0x38);
    ptr_fhandle = *(btree_kv_ops **)(afStack_1078[0].seqnum + 0x38);
    pfStack_11d0 = (fdb_doc *)0x1167ad;
    iVar6 = bcmp(pbVar11,ptr_fhandle,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(auStack_11c0._0_8_ + 8))
    ;
    if (iVar6 != 0) goto LAB_00116a48;
    pfStack_11d0 = (fdb_doc *)0x1167c2;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)auStack_11c0._8_8_,(fdb_doc *)doc_00);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116a53;
    if (*(char *)(auStack_11c0._0_8_ + 0x48) != '\0') {
      pfStack_11d0 = (fdb_doc *)0x1167df;
      read_doc_by_offset_test();
    }
    unaff_R12 = (char *)afStack_1078[0].seqnum;
    ptr_fhandle = (btree_kv_ops *)auStack_11c0._0_8_;
    doc_00 = *(btree_kv_ops **)(auStack_11c0._0_8_ + 0x38);
    pbVar11 = *(btree **)(afStack_1078[0].seqnum + 0x38);
    pfStack_11d0 = (fdb_doc *)0x116804;
    iVar6 = bcmp(doc_00,pbVar11,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(auStack_11c0._0_8_ + 8))
    ;
    if (iVar6 != 0) goto LAB_00116a58;
    doc_00 = *(btree_kv_ops **)((long)ptr_fhandle + 0x40);
    pbVar11 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)unaff_R12 + 0x40))->seqtree;
    pfStack_11d0 = (fdb_doc *)0x116824;
    iVar6 = bcmp(doc_00,pbVar11,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                          ((long)ptr_fhandle + 0x10));
    if (iVar6 != 0) goto LAB_00116a63;
    doc_00 = (btree_kv_ops *)(auStack_11b0 + 8);
    pfStack_11d0 = (fdb_doc *)0x11684d;
    fdb_doc_create((fdb_doc **)doc_00,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(btree_print_func **)(auStack_11b0._8_8_ + 0x30) =
         *(btree_print_func **)(auStack_11c0._0_8_ + 0x30);
    pfStack_11d0 = (fdb_doc *)0x116867;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)auStack_11c0._8_8_,(fdb_doc *)auStack_11b0._8_8_);
    __s2 = (btree_kv_ops *)auStack_11b0._8_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116a6e;
    doc_00 = *(btree_kv_ops **)(auStack_11b0._8_8_ + 0x20);
    pbVar11 = *(btree **)(afStack_1078[0].seqnum + 0x20);
    pfStack_11d0 = (fdb_doc *)0x116893;
    iVar6 = bcmp(doc_00,pbVar11,(size_t)*(size_t *)auStack_11b0._8_8_);
    unaff_R12 = (char *)afStack_1078[0].seqnum;
    if (iVar6 != 0) goto LAB_00116a73;
    doc_00 = *(btree_kv_ops **)((long)__s2 + 0x38);
    pbVar11 = *(btree **)(afStack_1078[0].seqnum + 0x38);
    pfStack_11d0 = (fdb_doc *)0x1168b3;
    iVar6 = bcmp(doc_00,pbVar11,*(bid_t *)((long)__s2 + 8));
    if (iVar6 != 0) goto LAB_00116a7e;
    doc_00 = *(btree_kv_ops **)((long)__s2 + 0x40);
    pbVar11 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(afStack_1078[0].seqnum + 0x40))->
              seqtree;
    pfStack_11d0 = (fdb_doc *)0x1168d3;
    iVar6 = bcmp(doc_00,pbVar11,(size_t)*(void **)((long)__s2 + 0x10));
    if (iVar6 != 0) goto LAB_00116a89;
    doc_00 = (btree_kv_ops *)auStack_11c0;
    pfStack_11d0 = (fdb_doc *)0x1168e8;
    fdb_doc_free((fdb_doc *)auStack_11c0._0_8_);
    pbVar11 = (btree *)0x0;
    auStack_11c0._0_8_ = (btree_kv_ops *)0x0;
    pfStack_11d0 = (fdb_doc *)0x1168f8;
    fdb_doc_free((fdb_doc *)auStack_11b0._8_8_);
    pfStack_11d0 = (fdb_doc *)0x116909;
    fdb_compact((fdb_file_handle *)auStack_11b0._0_8_,"./dummy2");
    pfStack_11d0 = (fdb_doc *)0x11692c;
    fdb_doc_create((fdb_doc **)doc_00,(void *)psStack_ee8[4],*psStack_ee8,(void *)0x0,0,(void *)0x0,
                   0);
    pfStack_11d0 = (fdb_doc *)0x116939;
    fVar5 = fdb_get_metaonly((fdb_kvs_handle *)auStack_11c0._8_8_,(fdb_doc *)auStack_11c0._0_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116a94;
    if (*(char *)(auStack_11c0._0_8_ + 0x48) == '\0') {
      pfStack_11d0 = (fdb_doc *)0x116956;
      read_doc_by_offset_test();
    }
    doc_00 = (btree_kv_ops *)auStack_11c0._0_8_;
    pbVar11 = *(btree **)(auStack_11c0._0_8_ + 0x38);
    __s2 = (btree_kv_ops *)psStack_ee8[7];
    pfStack_11d0 = (fdb_doc *)0x11697a;
    iVar6 = bcmp(pbVar11,__s2,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(auStack_11c0._0_8_ + 8))
    ;
    if (iVar6 != 0) goto LAB_00116a99;
    pfStack_11d0 = (fdb_doc *)0x11698f;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)auStack_11c0._8_8_,(fdb_doc *)doc_00);
    if (fVar5 == FDB_RESULT_KEY_NOT_FOUND) {
      if (*(char *)(auStack_11c0._0_8_ + 0x48) == '\0') {
        pfStack_11d0 = (fdb_doc *)0x1169ad;
        read_doc_by_offset_test();
      }
      pfStack_11d0 = (fdb_doc *)0x1169b7;
      fdb_doc_free((fdb_doc *)auStack_11c0._0_8_);
      auStack_11c0._0_8_ = (_func_void_bnode_ptr_idx_t_void_ptr_void_ptr *)0x0;
      lVar24 = 0;
      do {
        pfStack_11d0 = (fdb_doc *)0x1169cf;
        fdb_doc_free((fdb_doc *)(&afStack_1078[0].keylen)[lVar24]);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 100);
      pfStack_11d0 = (fdb_doc *)0x1169e2;
      fdb_kvs_close((fdb_kvs_handle *)auStack_11c0._8_8_);
      pfStack_11d0 = (fdb_doc *)0x1169ec;
      fdb_close((fdb_file_handle *)auStack_11b0._0_8_);
      pfStack_11d0 = (fdb_doc *)0x1169f1;
      fdb_shutdown();
      pfStack_11d0 = (fdb_doc *)0x1169f6;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (read_doc_by_offset_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_11d0 = (fdb_doc *)0x116a27;
      fprintf(_stderr,pcVar22,"read_doc_by_offset test");
      return;
    }
  }
  else {
    pfStack_11d0 = (fdb_doc *)0x116a3e;
    read_doc_by_offset_test();
LAB_00116a3e:
    pfStack_11d0 = (fdb_doc *)0x116a43;
    read_doc_by_offset_test();
LAB_00116a43:
    pfStack_11d0 = (fdb_doc *)0x116a48;
    read_doc_by_offset_test();
LAB_00116a48:
    pfStack_11d0 = (fdb_doc *)0x116a53;
    read_doc_by_offset_test();
LAB_00116a53:
    pfStack_11d0 = (fdb_doc *)0x116a58;
    read_doc_by_offset_test();
LAB_00116a58:
    pfStack_11d0 = (fdb_doc *)0x116a63;
    read_doc_by_offset_test();
LAB_00116a63:
    pfStack_11d0 = (fdb_doc *)0x116a6e;
    read_doc_by_offset_test();
LAB_00116a6e:
    __s2 = ptr_fhandle;
    pfStack_11d0 = (fdb_doc *)0x116a73;
    read_doc_by_offset_test();
LAB_00116a73:
    pfStack_11d0 = (fdb_doc *)0x116a7e;
    read_doc_by_offset_test();
LAB_00116a7e:
    pfStack_11d0 = (fdb_doc *)0x116a89;
    read_doc_by_offset_test();
LAB_00116a89:
    pfStack_11d0 = (fdb_doc *)0x116a94;
    read_doc_by_offset_test();
LAB_00116a94:
    pfStack_11d0 = (fdb_doc *)0x116a99;
    read_doc_by_offset_test();
LAB_00116a99:
    pfStack_11d0 = (fdb_doc *)0x116aa4;
    read_doc_by_offset_test();
  }
  pfStack_11d0 = (fdb_doc *)purge_logically_deleted_doc_test;
  read_doc_by_offset_test();
  pfStack_1698 = (fdb_doc *)0x116ac9;
  pbStack_11f8 = doc_00;
  pfStack_11f0 = (fdb_kvs_handle *)unaff_R12;
  pfStack_11e8 = (fdb_kvs_handle *)unaff_R13;
  pbStack_11e0 = pbVar11;
  pfStack_11d8 = (fdb_doc *)__s2;
  pfStack_11d0 = (fdb_doc *)pcVar22;
  gettimeofday(&tStack_1618,(__timezone_ptr_t)0x0);
  pfStack_1698 = (fdb_doc *)0x116ace;
  memleak_start();
  pfStack_1688 = (fdb_doc *)0x0;
  pfStack_1698 = (fdb_doc *)0x116adf;
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  pfStack_1698 = (fdb_doc *)0x116aef;
  fdb_get_default_config();
  pfVar13 = afStack_1608;
  pfStack_1698 = (fdb_doc *)0x116aff;
  fdb_get_default_kvs_config();
  fStack_12f0.buffercache_size = 0;
  fStack_12f0.wal_threshold = 0x400;
  fStack_12f0.flags = 1;
  fStack_12f0.purging_interval = 2;
  fStack_12f0.compaction_threshold = '\0';
  pbVar11 = (btree *)&pfStack_1678;
  pfStack_1698 = (fdb_doc *)0x116b34;
  fdb_open((fdb_file_handle **)pbVar11,"./dummy1",&fStack_12f0);
  pfVar16 = (fdb_kvs_handle *)&pfStack_1680;
  pfStack_1698 = (fdb_doc *)0x116b47;
  fdb_kvs_open_default(pfStack_1678,(fdb_kvs_handle **)pfVar16,(fdb_kvs_config *)pfVar13);
  pfStack_1698 = (fdb_doc *)0x116b5d;
  fVar5 = fdb_set_log_callback(pfStack_1680,logCallbackFunc,"purge_logically_deleted_doc_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (char *)0x0;
    uVar25 = 0;
    do {
      pfStack_1698 = (fdb_doc *)0x116b85;
      sprintf(acStack_13f0,"key%d",uVar25 & 0xffffffff);
      pfStack_1698 = (fdb_doc *)0x116b9d;
      sprintf((char *)afStack_14f0,"meta%d",uVar25 & 0xffffffff);
      pfStack_1698 = (fdb_doc *)0x116bb5;
      sprintf((char *)&afStack_1608[0].size_ondisk,"body%d",uVar25 & 0xffffffff);
      pbVar11 = (btree *)(auStack_1670 + (long)unaff_R12);
      pfStack_1698 = (fdb_doc *)0x116bc5;
      unaff_R13 = (code *)strlen(acStack_13f0);
      pcVar22 = (char *)afStack_14f0;
      pfStack_1698 = (fdb_doc *)0x116bd8;
      pfVar13 = (fdb_doc *)strlen(pcVar22);
      pfStack_1698 = (fdb_doc *)0x116be8;
      sVar7 = strlen((char *)&afStack_1608[0].size_ondisk);
      pfStack_1698 = (fdb_doc *)0x116c0d;
      fdb_doc_create((fdb_doc **)pbVar11,acStack_13f0,(size_t)unaff_R13,pcVar22,(size_t)pfVar13,
                     &afStack_1608[0].size_ondisk,sVar7);
      pfStack_1698 = (fdb_doc *)0x116c1c;
      fdb_set(pfStack_1680,*(fdb_doc **)(auStack_1670 + uVar25 * 8));
      uVar25 = uVar25 + 1;
      unaff_R12 = (char *)((long)unaff_R12 + 8);
    } while (uVar25 != 10);
    pfVar16 = (fdb_kvs_handle *)&pfStack_1688;
    pfStack_1698 = (fdb_doc *)0x116c59;
    fdb_doc_create((fdb_doc **)pfVar16,*(btree_kv_ops **)(auStack_1670._40_8_ + 0x20),
                   *(size_t *)auStack_1670._40_8_,*(btree_kv_ops **)(auStack_1670._40_8_ + 0x38),
                   *(bid_t *)(auStack_1670._40_8_ + 8),(void *)0x0,0);
    pfStack_1698 = (fdb_doc *)0x116c66;
    fVar5 = fdb_del(pfStack_1680,pfStack_1688);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfVar16 = (fdb_kvs_handle *)&pfStack_1688;
      pfStack_1698 = (fdb_doc *)0x116c7b;
      fdb_doc_free(pfStack_1688);
      pfStack_1688 = (fdb_doc *)0x0;
      pfStack_1698 = (fdb_doc *)0x116c91;
      fdb_commit(pfStack_1678,'\0');
      pfStack_1698 = (fdb_doc *)0x116ca2;
      fdb_compact(pfStack_1678,"./dummy2");
      unaff_R13 = (code *)0x0;
      pfVar19 = (fdb_doc *)pcVar22;
      do {
        pfStack_1698 = (fdb_doc *)0x116cc9;
        fdb_doc_create((fdb_doc **)pfVar16,
                       (void *)(*(size_t **)(auStack_1670 + (long)unaff_R13 * 8))[4],
                       **(size_t **)(auStack_1670 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_1698 = (fdb_doc *)0x116cd8;
        fVar5 = fdb_get(pfStack_1680,pfStack_1688);
        pcVar22 = (char *)pfStack_1688;
        if ((fdb_kvs_handle *)unaff_R13 != (fdb_kvs_handle *)0x5) {
          if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00116f87:
            pfStack_1698 = (fdb_doc *)0x116f8c;
            purge_logically_deleted_doc_test();
            pcVar22 = (char *)pfVar19;
            goto LAB_00116f8c;
          }
          pfVar13 = (fdb_doc *)pfStack_1688->meta;
          pfVar15 = *(fdb_kvs_handle **)(auStack_1670 + (long)unaff_R13 * 8);
          pbVar11 = pfVar15->staletree;
          pfStack_1698 = (fdb_doc *)0x116d14;
          iVar6 = bcmp(pfVar13,pbVar11,pfStack_1688->metalen);
          unaff_R12 = (char *)pfVar16;
          if (iVar6 == 0) {
            pfVar13 = (fdb_doc *)((fdb_doc *)pcVar22)->body;
            pbVar11 = (pfVar15->field_6).seqtree;
            pfStack_1698 = (fdb_doc *)0x116d33;
            iVar6 = bcmp(pfVar13,pbVar11,((fdb_doc *)pcVar22)->bodylen);
            if (iVar6 == 0) goto LAB_00116d44;
LAB_00116f7c:
            pfStack_1698 = (fdb_doc *)0x116f87;
            purge_logically_deleted_doc_test();
            pfVar19 = (fdb_doc *)pcVar22;
            goto LAB_00116f87;
          }
LAB_00116f91:
          pfStack_1698 = (fdb_doc *)0x116f9c;
          purge_logically_deleted_doc_test();
          goto LAB_00116f9c;
        }
        pcVar22 = (char *)pfVar19;
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) {
LAB_00116f8c:
          pfStack_1698 = (fdb_doc *)0x116f91;
          purge_logically_deleted_doc_test();
          pfVar15 = pfVar16;
          unaff_R12 = (char *)(fdb_kvs_handle *)0x0;
          goto LAB_00116f91;
        }
LAB_00116d44:
        unaff_R12 = (char *)0x0;
        pfStack_1698 = (fdb_doc *)0x116d4e;
        fdb_doc_free(pfStack_1688);
        pfStack_1688 = (fdb_doc *)0x0;
        pfStack_1698 = (fdb_doc *)0x116d73;
        fdb_doc_create((fdb_doc **)pfVar16,
                       (void *)(*(size_t **)(auStack_1670 + (long)unaff_R13 * 8))[4],
                       **(size_t **)(auStack_1670 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_1698 = (fdb_doc *)0x116d82;
        fVar5 = fdb_get_metaonly(pfStack_1680,pfStack_1688);
        if ((fdb_kvs_handle *)unaff_R13 == (fdb_kvs_handle *)0x5) {
          if ((fVar5 != FDB_RESULT_KEY_NOT_FOUND) && (fVar5 != FDB_RESULT_SUCCESS))
          goto LAB_00116fc6;
        }
        else if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_1698 = (fdb_doc *)0x116f7c;
          purge_logically_deleted_doc_test();
          goto LAB_00116f7c;
        }
        pfStack_1698 = (fdb_doc *)0x116da8;
        fdb_doc_free(pfStack_1688);
        pfStack_1688 = (fdb_doc *)0x0;
        unaff_R13 = (code *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
        pfVar19 = (fdb_doc *)pcVar22;
      } while (unaff_R13 != (code *)0xa);
      pfStack_1698 = (fdb_doc *)0x116dca;
      puts("wait for 3 seconds..");
      pfStack_1698 = (fdb_doc *)0x116dd4;
      sleep(3);
      pfStack_1698 = (fdb_doc *)0x116de5;
      fdb_compact(pfStack_1678,"./dummy3");
      pfVar15 = (fdb_kvs_handle *)&pfStack_1688;
      unaff_R13 = (code *)0x0;
      do {
        unaff_R12 = (char *)0x0;
        pfStack_1698 = (fdb_doc *)0x116e14;
        fdb_doc_create((fdb_doc **)pfVar15,
                       (void *)(*(size_t **)(auStack_1670 + (long)unaff_R13 * 8))[4],
                       **(size_t **)(auStack_1670 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_1698 = (fdb_doc *)0x116e23;
        fVar5 = fdb_get(pfStack_1680,pfStack_1688);
        pfVar19 = pfStack_1688;
        if ((fdb_kvs_handle *)unaff_R13 == (fdb_kvs_handle *)0x5) {
          pfVar19 = (fdb_doc *)pcVar22;
          if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116fa1;
        }
        else {
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116f9c;
          pfVar13 = (fdb_doc *)pfStack_1688->meta;
          unaff_R12 = *(char **)(auStack_1670 + (long)unaff_R13 * 8);
          pbVar11 = ((fdb_kvs_handle *)unaff_R12)->staletree;
          pfStack_1698 = (fdb_doc *)0x116e5d;
          iVar6 = bcmp(pfVar13,pbVar11,pfStack_1688->metalen);
          if (iVar6 != 0) goto LAB_00116fab;
          pfVar13 = (fdb_doc *)pfVar19->body;
          pbVar11 = (((fdb_kvs_handle *)unaff_R12)->field_6).seqtree;
          pfStack_1698 = (fdb_doc *)0x116e7d;
          iVar6 = bcmp(pfVar13,pbVar11,pfVar19->bodylen);
          unaff_R12 = (char *)0x0;
          if (iVar6 != 0) goto LAB_00116fbb;
        }
        unaff_R12 = (char *)0x0;
        pfStack_1698 = (fdb_doc *)0x116e95;
        fdb_doc_free(pfStack_1688);
        pfStack_1688 = (fdb_doc *)0x0;
        pfStack_1698 = (fdb_doc *)0x116eba;
        fdb_doc_create((fdb_doc **)pfVar15,
                       (void *)(*(size_t **)(auStack_1670 + (long)unaff_R13 * 8))[4],
                       **(size_t **)(auStack_1670 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_1698 = (fdb_doc *)0x116ec9;
        fVar5 = fdb_get_metaonly(pfStack_1680,pfStack_1688);
        if ((fdb_kvs_handle *)unaff_R13 == (fdb_kvs_handle *)0x5) {
          if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116fa6;
        }
        else if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116fb6;
        pfStack_1698 = (fdb_doc *)0x116eeb;
        fdb_doc_free(pfStack_1688);
        pfStack_1688 = (fdb_doc *)0x0;
        unaff_R13 = (code *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
        pcVar22 = (char *)pfVar19;
        if (unaff_R13 == (code *)0xa) {
          pfStack_1698 = (fdb_doc *)0x116f0b;
          fdb_kvs_close(pfStack_1680);
          pfStack_1698 = (fdb_doc *)0x116f15;
          fdb_close(pfStack_1678);
          lVar24 = 0;
          do {
            pfStack_1698 = (fdb_doc *)0x116f21;
            fdb_doc_free(*(fdb_doc **)(auStack_1670 + lVar24 * 8));
            lVar24 = lVar24 + 1;
          } while (lVar24 != 10);
          pfStack_1698 = (fdb_doc *)0x116f2f;
          fdb_shutdown();
          pfStack_1698 = (fdb_doc *)0x116f34;
          memleak_end();
          pcVar22 = "%s PASSED\n";
          if (purge_logically_deleted_doc_test()::__test_pass != '\0') {
            pcVar22 = "%s FAILED\n";
          }
          pfStack_1698 = (fdb_doc *)0x116f65;
          fprintf(_stderr,pcVar22,"purge logically deleted doc test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_00116fcb:
    pfStack_1698 = (fdb_doc *)0x116fd0;
    purge_logically_deleted_doc_test();
  }
  pfStack_1698 = (fdb_doc *)api_wrapper_test;
  purge_logically_deleted_doc_test();
  pfStack_1b20 = (fdb_doc *)0x116ff2;
  pfStack_16c0 = pfVar16;
  pfStack_16b8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_16b0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_16a8 = pfVar13;
  pbStack_16a0 = pbVar11;
  pfStack_1698 = (fdb_doc *)pcVar22;
  gettimeofday((timeval *)(auStack_1b00 + 0x10),(__timezone_ptr_t)0x0);
  pfStack_1b20 = (fdb_doc *)0x116ff7;
  memleak_start();
  pfStack_1b20 = (fdb_doc *)0x117003;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1b20 = (fdb_doc *)0x117013;
  fdb_get_default_config();
  pfVar15 = (fdb_kvs_handle *)auStack_1ae0;
  pfStack_1b20 = (fdb_doc *)0x117020;
  fdb_get_default_kvs_config();
  afStack_18c0[0].buffercache_size = 0;
  afStack_18c0[0].wal_threshold = 0x400;
  afStack_18c0[0].flags = 1;
  afStack_18c0[0].purging_interval = 0;
  afStack_18c0[0].compaction_threshold = '\0';
  pcVar26 = auStack_1b00 + 8;
  pfStack_1b20 = (fdb_doc *)0x117059;
  fdb_open((fdb_file_handle **)pcVar26,"./dummy1",afStack_18c0);
  pfVar16 = (fdb_kvs_handle *)&pfStack_1b10;
  pfStack_1b20 = (fdb_doc *)0x11706c;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1b00._8_8_,(fdb_kvs_handle **)pfVar16,
             (fdb_kvs_config *)pfVar15);
  pfStack_1b20 = (fdb_doc *)0x117082;
  fVar5 = fdb_set_log_callback(pfStack_1b10,logCallbackFunc,"api_wrapper_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_1b20 = (fdb_doc *)0x11709d;
    fVar5 = fdb_set_kv(pfStack_1b10,(void *)0x0,0,(void *)0x0,0);
    if (fVar5 != FDB_RESULT_INVALID_ARGS) goto LAB_001172ef;
    pcVar20 = auStack_1ae0 + 0x18;
    pcVar26 = "body%d";
    unaff_R12 = (char *)(afStack_18c0 + 1);
    pcVar22 = (char *)0x0;
    do {
      pfStack_1b20 = (fdb_doc *)0x1170cf;
      sprintf(pcVar20,"key%d",pcVar22);
      pfStack_1b20 = (fdb_doc *)0x1170de;
      sprintf(unaff_R12,"body%d",pcVar22);
      unaff_R13 = (code *)pfStack_1b10;
      pfStack_1b20 = (fdb_doc *)0x1170eb;
      pfVar16 = (fdb_kvs_handle *)strlen(pcVar20);
      pfStack_1b20 = (fdb_doc *)0x1170f6;
      sVar7 = strlen(unaff_R12);
      pfStack_1b20 = (fdb_doc *)0x11710a;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar20,(size_t)pfVar16,unaff_R12,sVar7);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_1b20 = (fdb_doc *)0x1172d0;
        api_wrapper_test();
        goto LAB_001172d0;
      }
      uVar21 = (int)pcVar22 + 1;
      pcVar22 = (char *)(ulong)uVar21;
    } while (uVar21 != 10);
    pfVar16 = (fdb_kvs_handle *)(auStack_1ae0 + 0x18);
    pfStack_1b20 = (fdb_doc *)0x117134;
    sprintf((char *)pfVar16,"key%d",5);
    pfVar15 = pfStack_1b10;
    pfStack_1b20 = (fdb_doc *)0x117141;
    sVar7 = strlen((char *)pfVar16);
    pfStack_1b20 = (fdb_doc *)0x11714f;
    fVar5 = fdb_del_kv(pfVar15,pfVar16,sVar7);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001172f4;
    pfStack_1b20 = (fdb_doc *)0x117165;
    fVar5 = fdb_del_kv(pfStack_1b10,(void *)0x0,0);
    if (fVar5 != FDB_RESULT_INVALID_ARGS) goto LAB_001172f9;
    pfVar15 = (fdb_kvs_handle *)(auStack_1ae0 + 0x18);
    pcVar26 = (char *)&pfStack_1b08;
    unaff_R12 = auStack_1b00;
    pcVar22 = (char *)afStack_19c8;
    unaff_R13 = (code *)0x0;
    do {
      pfStack_1b20 = (fdb_doc *)0x11719c;
      sprintf((char *)pfVar15,"key%d",unaff_R13);
      pfVar16 = pfStack_1b10;
      pfStack_1b20 = (fdb_doc *)0x1171a9;
      sVar7 = strlen((char *)pfVar15);
      pfStack_1b20 = (fdb_doc *)0x1171bd;
      fVar5 = fdb_get_kv(pfVar16,pfVar15,sVar7,(void **)pcVar26,(size_t *)unaff_R12);
      if ((int)unaff_R13 == 5) {
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001172e5;
      }
      else {
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001172e0;
        pfStack_1b20 = (fdb_doc *)0x1171e9;
        sprintf(pcVar22,"body%d",unaff_R13);
        pfVar16 = pfStack_1b08;
        pfStack_1b20 = (fdb_doc *)0x1171fe;
        iVar6 = bcmp(pfStack_1b08,pcVar22,auStack_1b00._0_8_);
        if (iVar6 != 0) goto LAB_001172d0;
        pfStack_1b20 = (fdb_doc *)0x11720e;
        fdb_free_block(pfVar16);
      }
      uVar21 = (int)unaff_R13 + 1;
      unaff_R13 = (code *)(ulong)uVar21;
    } while (uVar21 != 10);
    pfStack_1b20 = (fdb_doc *)0x117233;
    fVar5 = fdb_get_kv(pfStack_1b10,(void *)0x0,0,&pfStack_1b08,(size_t *)auStack_1b00);
    handle = pfStack_1b10;
    if (fVar5 != FDB_RESULT_INVALID_ARGS) goto LAB_001172fe;
    pfVar15 = (fdb_kvs_handle *)(auStack_1ae0 + 0x18);
    pfStack_1b20 = (fdb_doc *)0x11724e;
    sVar7 = strlen((char *)pfVar15);
    pfStack_1b20 = (fdb_doc *)0x117261;
    fVar5 = fdb_get_kv(handle,pfVar15,sVar7,(void **)0x0,(size_t *)0x0);
    if (fVar5 == FDB_RESULT_INVALID_ARGS) {
      pfStack_1b20 = (fdb_doc *)0x117274;
      fdb_kvs_close(pfStack_1b10);
      pfStack_1b20 = (fdb_doc *)0x11727e;
      fdb_close((fdb_file_handle *)auStack_1b00._8_8_);
      pfStack_1b20 = (fdb_doc *)0x117283;
      fdb_shutdown();
      pfStack_1b20 = (fdb_doc *)0x117288;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (api_wrapper_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_1b20 = (fdb_doc *)0x1172b9;
      fprintf(_stderr,pcVar22,"API wrapper test");
      return;
    }
  }
  else {
LAB_001172ea:
    pfStack_1b20 = (fdb_doc *)0x1172ef;
    api_wrapper_test();
LAB_001172ef:
    pfStack_1b20 = (fdb_doc *)0x1172f4;
    api_wrapper_test();
LAB_001172f4:
    pfStack_1b20 = (fdb_doc *)0x1172f9;
    api_wrapper_test();
LAB_001172f9:
    pfStack_1b20 = (fdb_doc *)0x1172fe;
    api_wrapper_test();
LAB_001172fe:
    handle = pfVar16;
    pfStack_1b20 = (fdb_doc *)0x117303;
    api_wrapper_test();
  }
  pfStack_1b20 = (fdb_doc *)flush_before_commit_test;
  api_wrapper_test();
  pfStack_20a8 = (fdb_doc *)0x117325;
  pfStack_1b48 = handle;
  pfStack_1b40 = (fdb_kvs_handle *)unaff_R12;
  pfStack_1b38 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1b30 = pfVar15;
  ppfStack_1b28 = (fdb_kvs_handle **)pcVar26;
  pfStack_1b20 = (fdb_doc *)pcVar22;
  gettimeofday(&tStack_2070,(__timezone_ptr_t)0x0);
  pfStack_20a8 = (fdb_doc *)0x11732a;
  memleak_start();
  pfStack_20a8 = (fdb_doc *)0x117336;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_20a8 = (fdb_doc *)0x117346;
  fdb_get_default_config();
  pfStack_20a8 = (fdb_doc *)0x117356;
  fdb_get_default_kvs_config();
  fStack_1e48.buffercache_size = 0;
  fStack_1e48.wal_threshold = 5;
  fStack_1e48.flags = 1;
  fStack_1e48.purging_interval = 0;
  fStack_1e48.compaction_threshold = '\0';
  fStack_1e48.wal_flush_before_commit = true;
  pfStack_20a8 = (fdb_doc *)0x11739a;
  fdb_open(&pfStack_2088,"dummy1",&fStack_1e48);
  pfStack_20a8 = (fdb_doc *)0x1173ad;
  fdb_open(&pfStack_2090,"dummy1",&fStack_1e48);
  pfStack_20a8 = (fdb_doc *)0x1173be;
  fdb_kvs_open_default(pfStack_2088,&pfStack_2078,&fStack_1f68);
  pfStack_20a8 = (fdb_doc *)0x1173d2;
  fdb_kvs_open_default(pfStack_2090,&pfStack_2080,&fStack_1f68);
  pfStack_20a8 = (fdb_doc *)0x1173e8;
  fVar5 = fdb_set_log_callback(pfStack_2080,logCallbackFunc,"flush_before_commit_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    ppfVar18 = apfStack_2060;
    uVar25 = 0;
    do {
      pfStack_20a8 = (fdb_doc *)0x117414;
      sprintf(acStack_1f50,"key%d",uVar25 & 0xffffffff);
      pfStack_20a8 = (fdb_doc *)0x117430;
      sprintf(acStack_1c50,"meta%d",uVar25 & 0xffffffff);
      pfStack_20a8 = (fdb_doc *)0x11744c;
      sprintf(acStack_1d50,"body%d",uVar25 & 0xffffffff);
      pfStack_20a8 = (fdb_doc *)0x117454;
      sVar7 = strlen(acStack_1f50);
      pfStack_20a8 = (fdb_doc *)0x11745f;
      sVar8 = strlen(acStack_1c50);
      pfStack_20a8 = (fdb_doc *)0x11746a;
      sVar12 = strlen(acStack_1d50);
      pfStack_20a8 = (fdb_doc *)0x11748a;
      fdb_doc_create(ppfVar18,acStack_1f50,sVar7,acStack_1c50,sVar8,acStack_1d50,sVar12);
      uVar25 = uVar25 + 1;
      ppfVar18 = ppfVar18 + 1;
    } while (uVar25 != 0x1e);
    pfStack_20a8 = (fdb_doc *)0x1174aa;
    fdb_begin_transaction(pfStack_2090,'\x02');
    lVar24 = 0;
    do {
      pfStack_20a8 = (fdb_doc *)0x1174bb;
      fdb_set(pfStack_2078,apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 == 1);
    lVar24 = 0;
    pfStack_20a8 = (fdb_doc *)0x1174d2;
    fdb_commit(pfStack_2088,'\0');
    do {
      pfStack_20a8 = (fdb_doc *)0x1174e1;
      fdb_set(pfStack_2080,apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 == 1);
    lVar24 = 0;
    pfStack_20a8 = (fdb_doc *)0x1174f8;
    fdb_end_transaction(pfStack_2090,'\0');
    pfStack_20a8 = (fdb_doc *)0x117507;
    fdb_commit(pfStack_2088,'\x01');
    pfStack_20a8 = (fdb_doc *)0x117516;
    fdb_begin_transaction(pfStack_2090,'\x02');
    do {
      pfStack_20a8 = (fdb_doc *)0x117525;
      fdb_set(pfStack_2080,apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 == 1);
    lVar24 = 0;
    pfStack_20a8 = (fdb_doc *)0x11753c;
    fdb_end_transaction(pfStack_2090,'\0');
    do {
      pfStack_20a8 = (fdb_doc *)0x11754b;
      fdb_set(pfStack_2078,apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 == 1);
    lVar24 = 0;
    pfStack_20a8 = (fdb_doc *)0x117562;
    fdb_commit(pfStack_2088,'\0');
    pfStack_20a8 = (fdb_doc *)0x117571;
    fdb_commit(pfStack_2088,'\x01');
    pfStack_20a8 = (fdb_doc *)0x117580;
    fdb_begin_transaction(pfStack_2090,'\x02');
    do {
      pfStack_20a8 = (fdb_doc *)0x11758f;
      fdb_set(pfStack_2080,apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 == 1);
    lVar24 = 0;
    do {
      pfStack_20a8 = (fdb_doc *)0x1175a9;
      fdb_set(pfStack_2078,apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 == 1);
    lVar24 = 0;
    pfStack_20a8 = (fdb_doc *)0x1175c0;
    fdb_commit(pfStack_2088,'\0');
    pfStack_20a8 = (fdb_doc *)0x1175cc;
    fdb_end_transaction(pfStack_2090,'\0');
    pfStack_20a8 = (fdb_doc *)0x1175db;
    fdb_commit(pfStack_2088,'\x01');
    pfStack_20a8 = (fdb_doc *)0x1175ea;
    fdb_begin_transaction(pfStack_2090,'\x02');
    do {
      pfStack_20a8 = (fdb_doc *)0x1175f9;
      fdb_set(pfStack_2078,apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 == 1);
    lVar24 = 0;
    do {
      pfStack_20a8 = (fdb_doc *)0x117613;
      fdb_set(pfStack_2080,apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 == 1);
    lVar24 = 0;
    pfStack_20a8 = (fdb_doc *)0x11762a;
    fdb_end_transaction(pfStack_2090,'\0');
    pfStack_20a8 = (fdb_doc *)0x117636;
    fdb_commit(pfStack_2088,'\0');
    pfStack_20a8 = (fdb_doc *)0x117645;
    fdb_commit(pfStack_2088,'\x01');
    pfStack_20a8 = (fdb_doc *)0x117654;
    fdb_begin_transaction(pfStack_2090,'\x02');
    do {
      pfStack_20a8 = (fdb_doc *)0x117663;
      fdb_set(pfStack_2080,apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 10);
    lVar24 = 0;
    do {
      pfStack_20a8 = (fdb_doc *)0x117680;
      fdb_set(pfStack_2078,apfStack_2060[lVar24 + 10]);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 10);
    pfStack_20a8 = (fdb_doc *)0x11769a;
    fdb_compact(pfStack_2088,"dummy2");
    lVar24 = 0;
    do {
      pfStack_20a8 = (fdb_doc *)0x1176ae;
      fdb_set(pfStack_2080,apfStack_2060[lVar24 + 0x14]);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 5);
    lVar24 = 0;
    pfStack_20a8 = (fdb_doc *)0x1176c5;
    fdb_end_transaction(pfStack_2090,'\0');
    do {
      pfStack_20a8 = (fdb_doc *)0x1176d7;
      fdb_set(pfStack_2078,apfStack_2060[lVar24 + 0x19]);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 5);
    pfStack_20a8 = (fdb_doc *)0x1176ea;
    fdb_close(pfStack_2088);
    pfStack_20a8 = (fdb_doc *)0x1176f4;
    fdb_close(pfStack_2090);
    lVar24 = 0;
    do {
      pfStack_20a8 = (fdb_doc *)0x117700;
      fdb_doc_free(apfStack_2060[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x1e);
    pfStack_20a8 = (fdb_doc *)0x11770e;
    fdb_shutdown();
    pfStack_20a8 = (fdb_doc *)0x117713;
    memleak_end();
    pcVar22 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar22 = "%s FAILED\n";
    }
    pfStack_20a8 = (fdb_doc *)0x117744;
    fprintf(_stderr,pcVar22,"flush before commit test");
    return;
  }
  pfStack_20a8 = (fdb_doc *)flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_20b0 = "dummy1";
  pfStack_2580 = (fdb_encryption_key *)0x11777e;
  pfStack_20d0 = &fStack_1f68;
  ppfStack_20c8 = &pfStack_2088;
  ppfStack_20c0 = &pfStack_2090;
  ppfStack_20b8 = &pfStack_2080;
  pfStack_20a8 = (fdb_doc *)pcVar22;
  gettimeofday(&tStack_24d8,(__timezone_ptr_t)0x0);
  pfStack_2580 = (fdb_encryption_key *)0x117783;
  memleak_start();
  pfStack_2570 = (fdb_doc *)0x0;
  pfStack_2580 = (fdb_encryption_key *)0x117794;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_2580 = (fdb_encryption_key *)0x1177a4;
  fdb_get_default_config();
  fStack_21c8.buffercache_size = 0;
  fStack_21c8.wal_threshold = 8;
  fStack_21c8.flags = 1;
  fStack_21c8.purging_interval = 0;
  fStack_21c8.compaction_threshold = '\0';
  fStack_21c8.wal_flush_before_commit = true;
  pfStack_2580 = (fdb_encryption_key *)0x1177d6;
  fdb_get_default_kvs_config();
  pfStack_2580 = (fdb_encryption_key *)0x1177ed;
  fdb_open(&pfStack_2558,"dummy1",&fStack_21c8);
  pfStack_2580 = (fdb_encryption_key *)0x1177ff;
  fdb_kvs_open(pfStack_2558,&pfStack_2568,(char *)0x0,&fStack_24f0);
  lVar24 = 0;
  uVar25 = 0;
  do {
    ppfVar14 = &fStack_24c8.bub_ctx.handle;
    pfStack_2580 = (fdb_encryption_key *)0x11781f;
    sprintf((char *)ppfVar14,"key%d",uVar25 & 0xffffffff);
    pfStack_2580 = (fdb_encryption_key *)0x117837;
    sprintf((char *)&fStack_24c8.config.encryption_key,"meta%d",uVar25 & 0xffffffff);
    pfStack_2580 = (fdb_encryption_key *)0x11784f;
    sprintf((char *)&fStack_24c8,"body%d",uVar25 & 0xffffffff);
    pfStack_2580 = (fdb_encryption_key *)0x11785f;
    sVar7 = strlen((char *)ppfVar14);
    pfVar23 = &fStack_24c8.config.encryption_key;
    pfStack_2580 = (fdb_encryption_key *)0x117872;
    sVar8 = strlen((char *)pfVar23);
    pfStack_2580 = (fdb_encryption_key *)0x117882;
    sVar12 = strlen((char *)&fStack_24c8);
    pfStack_2580 = (fdb_encryption_key *)0x1178a7;
    fdb_doc_create((fdb_doc **)((long)apfStack_2548 + lVar24),&fStack_24c8.bub_ctx.handle,sVar7,
                   pfVar23,sVar8,&fStack_24c8,sVar12);
    pfStack_2580 = (fdb_encryption_key *)0x1178b6;
    fdb_set(pfStack_2568,apfStack_2548[uVar25]);
    uVar25 = uVar25 + 1;
    lVar24 = lVar24 + 8;
  } while (uVar25 != 10);
  pfStack_2580 = (fdb_encryption_key *)0x1178d6;
  fdb_commit(pfStack_2558,'\x01');
  pfStack_2580 = (fdb_encryption_key *)0x1178f2;
  fdb_open(&pfStack_2550,"dummy1",&fStack_21c8);
  pfStack_2580 = (fdb_encryption_key *)0x117909;
  fdb_kvs_open(pfStack_2550,&pfStack_2560,(char *)0x0,&fStack_24f0);
  pfVar23 = &fStack_24c8.config.encryption_key;
  lVar24 = 0;
  uVar25 = 0;
  do {
    pfStack_2580 = (fdb_encryption_key *)0x117932;
    sprintf((char *)pfVar23,"meta2%d",uVar25 & 0xffffffff);
    pfStack_2580 = (fdb_encryption_key *)0x117946;
    sprintf((char *)&fStack_24c8,"body2%d(db2)",uVar25 & 0xffffffff);
    pfStack_2580 = (fdb_encryption_key *)0x117956;
    sVar7 = strlen((char *)pfVar23);
    pfStack_2580 = (fdb_encryption_key *)0x117961;
    sVar8 = strlen((char *)&fStack_24c8);
    pfStack_2580 = (fdb_encryption_key *)0x117975;
    fdb_doc_update((fdb_doc **)((long)apfStack_2548 + lVar24),pfVar23,sVar7,&fStack_24c8,sVar8);
    pfStack_2580 = (fdb_encryption_key *)0x117984;
    fdb_set(pfStack_2560,apfStack_2548[uVar25]);
    uVar25 = uVar25 + 1;
    lVar24 = lVar24 + 8;
  } while (uVar25 != 5);
  uVar25 = 5;
  lVar24 = 0x28;
  pfVar23 = &fStack_24c8.config.encryption_key;
  pfVar16 = &fStack_24c8;
  do {
    pfStack_2580 = (fdb_encryption_key *)0x1179c6;
    sprintf((char *)pfVar23,"meta2%d",uVar25 & 0xffffffff);
    pfStack_2580 = (fdb_encryption_key *)0x1179d5;
    sprintf((char *)pfVar16,"body2%d(db1)",uVar25 & 0xffffffff);
    pfStack_2580 = (fdb_encryption_key *)0x1179e5;
    sVar7 = strlen((char *)pfVar23);
    pfStack_2580 = (fdb_encryption_key *)0x1179f0;
    sVar8 = strlen((char *)pfVar16);
    pfStack_2580 = (fdb_encryption_key *)0x117a0b;
    fdb_doc_update((fdb_doc **)((long)apfStack_2548 + lVar24),pfVar23,sVar7,pfVar16,sVar8);
    pfStack_2580 = (fdb_encryption_key *)0x117a1a;
    fdb_set(pfStack_2568,apfStack_2548[uVar25]);
    uVar25 = uVar25 + 1;
    lVar24 = lVar24 + 8;
  } while (uVar25 != 10);
  ppfVar14 = &fStack_24c8.bub_ctx.handle;
  pfVar23 = &fStack_24c8.config.encryption_key;
  uVar25 = 0;
  do {
    pcVar22 = "body2%d(db1)";
    pfStack_2580 = (fdb_encryption_key *)0x117a54;
    sprintf((char *)ppfVar14,"key%d",uVar25);
    pfStack_2580 = (fdb_encryption_key *)0x117a67;
    sprintf((char *)pfVar23,"meta2%d",uVar25);
    if ((uint)uVar25 < 5) {
      pcVar22 = "body2%d(db2)";
    }
    pfStack_2580 = (fdb_encryption_key *)0x117a84;
    sprintf((char *)&fStack_24c8,pcVar22,uVar25);
    pfStack_2580 = (fdb_encryption_key *)0x117a8c;
    sVar7 = strlen((char *)ppfVar14);
    pfStack_2580 = (fdb_encryption_key *)0x117aac;
    fdb_doc_create(&pfStack_2570,ppfVar14,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_2580 = (fdb_encryption_key *)0x117abb;
    fVar5 = fdb_get(pfStack_2568,pfStack_2570);
    pfVar13 = pfStack_2570;
    if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00117dc9:
      pfStack_2580 = (fdb_encryption_key *)0x117dce;
      flush_before_commit_multi_writers_test();
LAB_00117dce:
      pfStack_2580 = (fdb_encryption_key *)0x117dd3;
      flush_before_commit_multi_writers_test();
      pfVar13 = (fdb_doc *)pcVar22;
LAB_00117dd3:
      pfStack_2580 = (fdb_encryption_key *)0x117de3;
      flush_before_commit_multi_writers_test();
LAB_00117de3:
      pfStack_2580 = (fdb_encryption_key *)0x117df3;
      flush_before_commit_multi_writers_test();
LAB_00117df3:
      pfStack_2580 = (fdb_encryption_key *)0x117e03;
      flush_before_commit_multi_writers_test();
      goto LAB_00117e03;
    }
    pfVar16 = (fdb_kvs_handle *)pfStack_2570->meta;
    pfStack_2580 = (fdb_encryption_key *)0x117adb;
    iVar6 = bcmp(pfVar23,pfVar16,pfStack_2570->metalen);
    if (iVar6 != 0) {
      pfStack_2580 = (fdb_encryption_key *)0x117dc9;
      flush_before_commit_multi_writers_test();
      pcVar22 = (char *)pfVar13;
      goto LAB_00117dc9;
    }
    pfVar16 = (fdb_kvs_handle *)pfVar13->body;
    pfStack_2580 = (fdb_encryption_key *)0x117af6;
    iVar6 = bcmp(&fStack_24c8,pfVar16,pfVar13->bodylen);
    if (iVar6 != 0) goto LAB_00117dd3;
    pfStack_2580 = (fdb_encryption_key *)0x117b06;
    fdb_doc_free(pfVar13);
    pcVar22 = (char *)0x0;
    pfStack_2570 = (fdb_doc *)0x0;
    pfStack_2580 = (fdb_encryption_key *)0x117b16;
    sVar7 = strlen((char *)ppfVar14);
    pfStack_2580 = (fdb_encryption_key *)0x117b32;
    fdb_doc_create(&pfStack_2570,ppfVar14,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_2580 = (fdb_encryption_key *)0x117b41;
    fVar5 = fdb_get(pfStack_2560,pfStack_2570);
    pfVar13 = pfStack_2570;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00117dce;
    pfVar16 = (fdb_kvs_handle *)pfStack_2570->meta;
    pfStack_2580 = (fdb_encryption_key *)0x117b61;
    iVar6 = bcmp(pfVar23,pfVar16,pfStack_2570->metalen);
    if (iVar6 != 0) goto LAB_00117df3;
    pfVar16 = (fdb_kvs_handle *)pfVar13->body;
    pfStack_2580 = (fdb_encryption_key *)0x117b7c;
    iVar6 = bcmp(&fStack_24c8,pfVar16,pfVar13->bodylen);
    if (iVar6 != 0) goto LAB_00117de3;
    pfStack_2580 = (fdb_encryption_key *)0x117b8c;
    fdb_doc_free(pfVar13);
    pfStack_2570 = (fdb_doc *)0x0;
    uVar21 = (uint)uVar25 + 1;
    uVar25 = (ulong)uVar21;
  } while (uVar21 != 10);
  pfStack_2580 = (fdb_encryption_key *)0x117bb3;
  fdb_commit(pfStack_2558,'\0');
  pfStack_2580 = (fdb_encryption_key *)0x117bbf;
  fdb_commit(pfStack_2550,'\0');
  ppfVar14 = &fStack_24c8.bub_ctx.handle;
  pfVar23 = &fStack_24c8.config.encryption_key;
  uVar25 = 0;
  while( true ) {
    pfStack_2580 = (fdb_encryption_key *)0x117bf3;
    sprintf((char *)ppfVar14,"key%d",uVar25);
    pfStack_2580 = (fdb_encryption_key *)0x117c06;
    sprintf((char *)pfVar23,"meta2%d",uVar25);
    pcVar22 = "body2%d(db1)";
    if ((uint)uVar25 < 5) {
      pcVar22 = "body2%d(db2)";
    }
    pfStack_2580 = (fdb_encryption_key *)0x117c20;
    sprintf((char *)&fStack_24c8,pcVar22,uVar25);
    pfStack_2580 = (fdb_encryption_key *)0x117c28;
    sVar7 = strlen((char *)ppfVar14);
    pfStack_2580 = (fdb_encryption_key *)0x117c48;
    fdb_doc_create(&pfStack_2570,ppfVar14,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_2580 = (fdb_encryption_key *)0x117c57;
    fVar5 = fdb_get(pfStack_2568,pfStack_2570);
    pfVar13 = pfStack_2570;
    pfVar19 = (fdb_doc *)"body2%d(db2)";
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    pfVar16 = (fdb_kvs_handle *)pfStack_2570->meta;
    pfStack_2580 = (fdb_encryption_key *)0x117c77;
    iVar6 = bcmp(pfVar23,pfVar16,pfStack_2570->metalen);
    if (iVar6 != 0) goto LAB_00117e03;
    pfVar16 = (fdb_kvs_handle *)pfVar13->body;
    pfStack_2580 = (fdb_encryption_key *)0x117c92;
    iVar6 = bcmp(&fStack_24c8,pfVar16,pfVar13->bodylen);
    if (iVar6 != 0) goto LAB_00117e1d;
    pfStack_2580 = (fdb_encryption_key *)0x117ca2;
    fdb_doc_free(pfVar13);
    pfVar19 = (fdb_doc *)0x0;
    pfStack_2570 = (fdb_doc *)0x0;
    pfStack_2580 = (fdb_encryption_key *)0x117cb2;
    sVar7 = strlen((char *)ppfVar14);
    pfStack_2580 = (fdb_encryption_key *)0x117cce;
    fdb_doc_create(&pfStack_2570,ppfVar14,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_2580 = (fdb_encryption_key *)0x117cdd;
    fVar5 = fdb_get(pfStack_2560,pfStack_2570);
    pfVar13 = pfStack_2570;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00117e18;
    pfVar16 = (fdb_kvs_handle *)pfStack_2570->meta;
    pfStack_2580 = (fdb_encryption_key *)0x117cfd;
    iVar6 = bcmp(pfVar23,pfVar16,pfStack_2570->metalen);
    if (iVar6 != 0) goto LAB_00117e3d;
    pfVar16 = (fdb_kvs_handle *)pfVar13->body;
    pfStack_2580 = (fdb_encryption_key *)0x117d18;
    iVar6 = bcmp(&fStack_24c8,pfVar16,pfVar13->bodylen);
    if (iVar6 != 0) goto LAB_00117e2d;
    pfStack_2580 = (fdb_encryption_key *)0x117d28;
    fdb_doc_free(pfVar13);
    pfStack_2570 = (fdb_doc *)0x0;
    uVar21 = (uint)uVar25 + 1;
    uVar25 = (ulong)uVar21;
    if (uVar21 == 10) {
      pfStack_2580 = (fdb_encryption_key *)0x117d4d;
      fdb_close(pfStack_2558);
      pfStack_2580 = (fdb_encryption_key *)0x117d57;
      fdb_close(pfStack_2550);
      lVar24 = 0;
      do {
        pfStack_2580 = (fdb_encryption_key *)0x117d63;
        fdb_doc_free(apfStack_2548[lVar24]);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 10);
      pfStack_2580 = (fdb_encryption_key *)0x117d71;
      fdb_shutdown();
      pfStack_2580 = (fdb_encryption_key *)0x117d76;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_2580 = (fdb_encryption_key *)0x117da7;
      fprintf(_stderr,pcVar22,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00117e13:
  pfStack_2580 = (fdb_encryption_key *)0x117e18;
  flush_before_commit_multi_writers_test();
LAB_00117e18:
  pfStack_2580 = (fdb_encryption_key *)0x117e1d;
  flush_before_commit_multi_writers_test();
  pfVar13 = pfVar19;
LAB_00117e1d:
  pfStack_2580 = (fdb_encryption_key *)0x117e2d;
  flush_before_commit_multi_writers_test();
LAB_00117e2d:
  pfStack_2580 = (fdb_encryption_key *)0x117e3d;
  flush_before_commit_multi_writers_test();
LAB_00117e3d:
  pfVar15 = &fStack_24c8;
  ppfVar14 = &fStack_24c8.bub_ctx.handle;
  pfVar23 = &fStack_24c8.config.encryption_key;
  pfStack_2580 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_28f8 = (fdb_encryption_key *)0x117e6a;
  uStack_25a8 = uVar25;
  ppfStack_25a0 = ppfVar14;
  pfStack_2598 = pfVar16;
  pfStack_2590 = pfVar13;
  pfStack_2588 = pfVar15;
  pfStack_2580 = pfVar23;
  gettimeofday((timeval *)(auStack_28d0 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_28f8 = (fdb_encryption_key *)0x117e6f;
  memleak_start();
  pfStack_28f8 = (fdb_encryption_key *)0x117e7b;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar17 = &fStack_26a0;
  pfStack_28f8 = (fdb_encryption_key *)0x117e8b;
  fdb_get_default_config();
  pfStack_28f8 = (fdb_encryption_key *)0x117e95;
  fdb_get_default_kvs_config();
  fStack_26a0.buffercache_size = 0;
  fStack_26a0.wal_threshold = 0x1000;
  fStack_26a0.flags = 1;
  fStack_26a0.durability_opt = '\x02';
  fStack_26a0.auto_commit = true;
  pfStack_28f8 = (fdb_encryption_key *)0x117ec8;
  fVar5 = fdb_open(&pfStack_28e0,"dummy1",pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_28f8 = (fdb_encryption_key *)0x117ee4;
    fVar5 = fdb_kvs_open_default(pfStack_28e0,&pfStack_28e8,(fdb_kvs_config *)(auStack_28d0 + 8));
    pcVar22 = (char *)pfVar15;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118182;
    pcVar22 = "body%d";
    pfVar23 = (fdb_encryption_key *)0x0;
    do {
      pfStack_28f8 = (fdb_encryption_key *)0x117f15;
      sprintf((char *)afStack_27a0,"key%d",pfVar23);
      pfStack_28f8 = (fdb_encryption_key *)0x117f24;
      sprintf((char *)apfStack_28a0,"body%d",pfVar23);
      pfVar16 = pfStack_28e8;
      pfStack_28f8 = (fdb_encryption_key *)0x117f31;
      sVar7 = strlen((char *)afStack_27a0);
      pfVar17 = (fdb_config *)(sVar7 + 1);
      pfStack_28f8 = (fdb_encryption_key *)0x117f3d;
      sVar7 = strlen((char *)apfStack_28a0);
      pfStack_28f8 = (fdb_encryption_key *)0x117f52;
      fVar5 = fdb_set_kv(pfVar16,afStack_27a0,(size_t)pfVar17,apfStack_28a0,sVar7 + 1);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_28f8 = (fdb_encryption_key *)0x118159;
        auto_commit_test();
        goto LAB_00118159;
      }
      uVar21 = (int)pfVar23 + 1;
      pfVar23 = (fdb_encryption_key *)(ulong)uVar21;
    } while (uVar21 != 5000);
    pfVar13 = afStack_27a0;
    ppfVar14 = apfStack_28a0;
    pfVar16 = (fdb_kvs_handle *)auStack_28d0;
    pfVar23 = (fdb_encryption_key *)auStack_28d8;
    pfVar17 = (fdb_config *)0x0;
    do {
      pfStack_28f8 = (fdb_encryption_key *)0x117f90;
      sprintf((char *)pfVar13,"key%d",pfVar17);
      pfStack_28f8 = (fdb_encryption_key *)0x117fa3;
      sprintf((char *)ppfVar14,"body%d",pfVar17);
      pfVar15 = pfStack_28e8;
      pfStack_28f8 = (fdb_encryption_key *)0x117fb0;
      sVar7 = strlen((char *)pfVar13);
      pfStack_28f8 = (fdb_encryption_key *)0x117fc5;
      fVar5 = fdb_get_kv(pfVar15,pfVar13,sVar7 + 1,(void **)pfVar16,(size_t *)pfVar23);
      pcVar22 = (char *)auStack_28d0._0_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118166;
      pfStack_28f8 = (fdb_encryption_key *)0x117fe2;
      iVar6 = bcmp((void *)auStack_28d0._0_8_,ppfVar14,(size_t)auStack_28d8);
      if (iVar6 != 0) goto LAB_00118159;
      pfStack_28f8 = (fdb_encryption_key *)0x117ff2;
      fdb_free_block(pcVar22);
      uVar21 = (int)pfVar17 + 1;
      pfVar17 = (fdb_config *)(ulong)uVar21;
    } while (uVar21 != 5000);
    pfStack_28f8 = (fdb_encryption_key *)0x118006;
    fVar5 = fdb_kvs_close(pfStack_28e8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118187;
    pfStack_28f8 = (fdb_encryption_key *)0x118018;
    fVar5 = fdb_close(pfStack_28e0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011818c;
    pfStack_28f8 = (fdb_encryption_key *)0x118039;
    fVar5 = fdb_open(&pfStack_28e0,"dummy1",&fStack_26a0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118191;
    pfStack_28f8 = (fdb_encryption_key *)0x118055;
    fVar5 = fdb_kvs_open_default(pfStack_28e0,&pfStack_28e8,(fdb_kvs_config *)(auStack_28d0 + 8));
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118196;
    pfVar13 = afStack_27a0;
    ppfVar14 = apfStack_28a0;
    pfVar16 = (fdb_kvs_handle *)auStack_28d0;
    pfVar23 = (fdb_encryption_key *)auStack_28d8;
    pfVar17 = (fdb_config *)0x0;
    do {
      pfStack_28f8 = (fdb_encryption_key *)0x118089;
      sprintf((char *)pfVar13,"key%d",pfVar17);
      pfStack_28f8 = (fdb_encryption_key *)0x11809c;
      sprintf((char *)ppfVar14,"body%d",pfVar17);
      pfVar15 = pfStack_28e8;
      pfStack_28f8 = (fdb_encryption_key *)0x1180a9;
      sVar7 = strlen((char *)pfVar13);
      pfStack_28f8 = (fdb_encryption_key *)0x1180be;
      fVar5 = fdb_get_kv(pfVar15,pfVar13,sVar7 + 1,(void **)pfVar16,(size_t *)pfVar23);
      pcVar22 = (char *)auStack_28d0._0_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118178;
      pfStack_28f8 = (fdb_encryption_key *)0x1180db;
      iVar6 = bcmp((void *)auStack_28d0._0_8_,ppfVar14,(size_t)auStack_28d8);
      if (iVar6 != 0) goto LAB_0011816b;
      pfStack_28f8 = (fdb_encryption_key *)0x1180eb;
      fdb_free_block(pcVar22);
      uVar21 = (int)pfVar17 + 1;
      pfVar17 = (fdb_config *)(ulong)uVar21;
    } while (uVar21 != 5000);
    pfStack_28f8 = (fdb_encryption_key *)0x1180ff;
    fVar5 = fdb_close(pfStack_28e0);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_28f8 = (fdb_encryption_key *)0x11810c;
      fdb_shutdown();
      pfStack_28f8 = (fdb_encryption_key *)0x118111;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_28f8 = (fdb_encryption_key *)0x118142;
      fprintf(_stderr,pcVar22,"auto commit test");
      return;
    }
  }
  else {
LAB_0011817d:
    pfStack_28f8 = (fdb_encryption_key *)0x118182;
    auto_commit_test();
    pcVar22 = (char *)pfVar15;
LAB_00118182:
    pfStack_28f8 = (fdb_encryption_key *)0x118187;
    auto_commit_test();
LAB_00118187:
    pfStack_28f8 = (fdb_encryption_key *)0x11818c;
    auto_commit_test();
LAB_0011818c:
    pfStack_28f8 = (fdb_encryption_key *)0x118191;
    auto_commit_test();
LAB_00118191:
    pfStack_28f8 = (fdb_encryption_key *)0x118196;
    auto_commit_test();
LAB_00118196:
    pfStack_28f8 = (fdb_encryption_key *)0x11819b;
    auto_commit_test();
  }
  pfStack_28f8 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_2b70 = (code *)0x1181bd;
  pfStack_2920 = pfVar17;
  ppfStack_2918 = ppfVar14;
  pfStack_2910 = pfVar16;
  pfStack_2908 = pfVar13;
  pfStack_2900 = (fdb_kvs_handle *)pcVar22;
  pfStack_28f8 = pfVar23;
  gettimeofday(&tStack_2b20,(__timezone_ptr_t)0x0);
  pcStack_2b70 = (code *)0x1181c2;
  memleak_start();
  pcStack_2b70 = (code *)0x1181ce;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_2b70 = (code *)0x1181de;
  fdb_get_default_config();
  fStack_2a18.buffercache_size = 0;
  fStack_2a18.auto_commit = true;
  pcStack_2b70 = (code *)0x1181f7;
  fdb_get_default_config();
  pcStack_2b70 = (code *)0x118207;
  memcpy(&fStack_2a18,afStack_2b10,0xf8);
  pcStack_2b70 = (code *)0x118211;
  fdb_get_default_kvs_config();
  uVar25 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_2b58 + 8,"est1",5);
    builtin_strncpy(acStack_2b58,"./func_t",8);
    pcStack_2b70 = (code *)0x11825c;
    fVar5 = fdb_open(&pfStack_2b68,acStack_2b58,&fStack_2a18);
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    pcStack_2b70 = (code *)0x118278;
    fVar5 = fdb_kvs_open(pfStack_2b68,&pfStack_2b60,"justonekv",&fStack_2b38);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pcStack_2b70 = (code *)0x118331;
      auto_commit_space_used_test();
      break;
    }
    pcStack_2b70 = (code *)0x11828e;
    fVar5 = fdb_get_file_info(pfStack_2b68,afStack_2b10);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011833b;
    if (afStack_2b10[0].file_size != fStack_2a18.blocksize * 7) {
      pcStack_2b70 = (code *)0x1182dd;
      auto_commit_space_used_test();
    }
    pcStack_2b70 = (code *)0x1182b9;
    fVar5 = fdb_close(pfStack_2b68);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118336;
    uVar21 = (int)uVar25 + 1;
    uVar25 = (ulong)uVar21;
    if (uVar21 == 0) {
      pcStack_2b70 = (code *)0x1182e4;
      fdb_shutdown();
      pcStack_2b70 = (code *)0x1182e9;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pcStack_2b70 = (code *)0x11831a;
      fprintf(_stderr,pcVar22,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_2b70 = (code *)0x118336;
  auto_commit_space_used_test();
LAB_00118336:
  pcStack_2b70 = (code *)0x11833b;
  auto_commit_space_used_test();
LAB_0011833b:
  pcStack_2b70 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_2b78 = 0x745f636e75662f2e;
  pcStack_2b88 = "justonekv";
  ppfStack_3108 = (fdb_kvs_handle **)0x118363;
  ppfStack_2b98 = &pfStack_2b60;
  pcStack_2b90 = acStack_2b58;
  uStack_2b80 = uVar25;
  pcStack_2b70 = (code *)&pfStack_2b68;
  gettimeofday(&tStack_2fa8,(__timezone_ptr_t)0x0);
  ppfStack_3108 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  pfStack_30f0 = (fdb_doc *)0x0;
  ppfStack_3108 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_3108 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_3108 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  fStack_2f98.buffercache_size = 0;
  fStack_2f98.flags = 1;
  fStack_2f98.purging_interval = 0;
  fStack_2f98.compaction_threshold = '\0';
  ppfStack_3108 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(auStack_30e0 + 0x10),"dummy1",&fStack_2f98);
  ppfStack_3108 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)auStack_30e0,"dummy1",&fStack_2f98);
  ppfStack_3108 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30e0._16_8_,&pfStack_30e8,&fStack_30b8);
  ppfStack_3108 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_30e0._0_8_,(fdb_kvs_handle **)(auStack_30e0 + 8),
             &fStack_30b8);
  ppfVar18 = apfStack_30a0;
  uVar25 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x118422;
    sprintf(acStack_2ea0,"key%d",uVar25 & 0xffffffff);
    ppfStack_3108 = (fdb_kvs_handle **)0x11843e;
    sprintf(acStack_2ca0,"meta%d",uVar25 & 0xffffffff);
    ppfVar10 = apfStack_2da0;
    ppfStack_3108 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ppfVar10,"body%d",uVar25 & 0xffffffff);
    ppfStack_3108 = (fdb_kvs_handle **)0x118462;
    ppfVar14 = (fdb_kvs_handle **)strlen(acStack_2ea0);
    ppfStack_3108 = (fdb_kvs_handle **)0x11846d;
    sVar7 = strlen(acStack_2ca0);
    ppfStack_3108 = (fdb_kvs_handle **)0x118478;
    sVar8 = strlen((char *)ppfVar10);
    ppfStack_3108 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar18,acStack_2ea0,(size_t)ppfVar14,acStack_2ca0,sVar7,ppfVar10,sVar8);
    uVar25 = uVar25 + 1;
    ppfVar18 = ppfVar18 + 1;
  } while (uVar25 != 0x1e);
  lVar24 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(pfStack_30e8,apfStack_30a0[lVar24]);
    lVar24 = lVar24 + 1;
  } while (lVar24 == 1);
  ppfStack_3108 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)auStack_30e0._0_8_,'\x02');
  lVar24 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)auStack_30e0._8_8_,apfStack_30a0[lVar24 + 2]);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 2);
  ppfStack_3108 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)auStack_30e0._16_8_,'\x01');
  ppfStack_3108 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)auStack_30e0._16_8_);
  ppfStack_3108 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)auStack_30e0._0_8_);
  ppfVar27 = (fdb_kvs_handle **)0x1551a5;
  pfVar17 = &fStack_2f98;
  ppfStack_3108 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(auStack_30e0 + 0x10),"dummy1",pfVar17);
  ppfStack_3108 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)auStack_30e0,"dummy1",pfVar17);
  ppfStack_3108 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30e0._16_8_,&pfStack_30e8,&fStack_30b8);
  ppfStack_3108 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_30e0._0_8_,(fdb_kvs_handle **)(auStack_30e0 + 8),
             &fStack_30b8);
  uVar25 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&pfStack_30f0,apfStack_30a0[uVar25]->key,apfStack_30a0[uVar25]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3108 = (fdb_kvs_handle **)0x11859e;
    fVar5 = fdb_get(pfStack_30e8,pfStack_30f0);
    if (uVar25 < 2) {
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_3108 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(pfStack_30f0);
    pfStack_30f0 = (fdb_doc *)0x0;
    uVar25 = uVar25 + 1;
  } while (uVar25 != 4);
  ppfStack_3108 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)auStack_30e0._0_8_,'\x02');
  lVar24 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)auStack_30e0._8_8_,apfStack_30a0[lVar24 + 2]);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 2);
  lVar24 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x11860e;
    fdb_set(pfStack_30e8,apfStack_30a0[lVar24 + 4]);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 2);
  ppfStack_3108 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)auStack_30e0._0_8_,'\x01');
  ppfStack_3108 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)auStack_30e0._16_8_);
  ppfStack_3108 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)auStack_30e0._0_8_);
  ppfVar27 = (fdb_kvs_handle **)0x1551a5;
  pfVar17 = &fStack_2f98;
  ppfStack_3108 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(auStack_30e0 + 0x10),"dummy1",pfVar17);
  ppfStack_3108 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)auStack_30e0,"dummy1",pfVar17);
  ppfStack_3108 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30e0._16_8_,&pfStack_30e8,&fStack_30b8);
  ppfStack_3108 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_30e0._0_8_,(fdb_kvs_handle **)(auStack_30e0 + 8),
             &fStack_30b8);
  uVar25 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&pfStack_30f0,apfStack_30a0[uVar25]->key,apfStack_30a0[uVar25]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3108 = (fdb_kvs_handle **)0x1186c9;
    fVar5 = fdb_get(pfStack_30e8,pfStack_30f0);
    if ((uVar25 < 4) && (fVar5 != FDB_RESULT_SUCCESS)) {
      ppfStack_3108 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_3108 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(pfStack_30f0);
    pfStack_30f0 = (fdb_doc *)0x0;
    uVar25 = uVar25 + 1;
  } while (uVar25 != 6);
  lVar24 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x118707;
    fdb_set(pfStack_30e8,apfStack_30a0[lVar24 + 4]);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 2);
  ppfStack_3108 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)auStack_30e0._0_8_,'\x02');
  lVar24 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)auStack_30e0._8_8_,apfStack_30a0[lVar24 + 6]);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 2);
  ppfStack_3108 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)auStack_30e0._16_8_,'\x01');
  ppfStack_3108 = (fdb_kvs_handle **)0x118767;
  fdb_open(&pfStack_30c8,"dummy1",&fStack_2f98);
  ppfStack_3108 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(pfStack_30c8,&pfStack_30c0,&fStack_30b8);
  ppfStack_3108 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(pfStack_30c8,'\x02');
  lVar24 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x11879a;
    fdb_set(pfStack_30c0,apfStack_30a0[lVar24 + 8]);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 2);
  ppfStack_3108 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(pfStack_30c8,'\x01');
  ppfStack_3108 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)auStack_30e0._16_8_);
  ppfStack_3108 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)auStack_30e0._0_8_);
  ppfStack_3108 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(pfStack_30c8);
  ppfStack_3108 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(auStack_30e0 + 0x10),"dummy1",&fStack_2f98);
  ppfStack_3108 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30e0._16_8_,&pfStack_30e8,&fStack_30b8);
  uVar25 = 0;
  do {
    ppfStack_3108 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&pfStack_30f0,apfStack_30a0[uVar25]->key,apfStack_30a0[uVar25]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3108 = (fdb_kvs_handle **)0x118837;
    fVar5 = fdb_get(pfStack_30e8,pfStack_30f0);
    if ((int)uVar25 - 8U < 0xfffffffe) {
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_3108 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(pfStack_30f0);
    pfStack_30f0 = (fdb_doc *)0x0;
    uVar25 = uVar25 + 1;
  } while (uVar25 != 10);
  pfVar17 = (fdb_config *)auStack_30e0;
  ppfStack_3108 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar17,"dummy1",&fStack_2f98);
  ppfVar10 = &pfStack_30c8;
  ppfStack_3108 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ppfVar10,"dummy1",&fStack_2f98);
  ppfVar27 = (fdb_kvs_handle **)(auStack_30e0 + 8);
  ppfStack_3108 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30e0._0_8_,ppfVar27,&fStack_30b8);
  ppfStack_3108 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(pfStack_30c8,&pfStack_30c0,&fStack_30b8);
  ppfStack_3108 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)auStack_30e0._0_8_,'\x02');
  ppfVar14 = &pfStack_30e8;
  ppfStack_3108 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(pfStack_30e8,apfStack_30a0[10]);
  ppfStack_3108 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)auStack_30e0._16_8_,'\x01');
  ppfStack_3108 = (fdb_kvs_handle **)0x118916;
  fdb_set(pfStack_30e8,apfStack_30a0[0xb]);
  ppfStack_3108 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)auStack_30e0._8_8_,apfStack_30a0[0xc]);
  ppfStack_3108 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)auStack_30e0._16_8_,'\x01');
  ppfStack_3108 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)auStack_30e0._8_8_,apfStack_30a0[0xd]);
  ppfStack_3108 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(pfStack_30c8,'\x02');
  ppfStack_3108 = (fdb_kvs_handle **)0x118961;
  fdb_set(pfStack_30c0,apfStack_30a0[0xe]);
  ppfStack_3108 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)auStack_30e0._0_8_,'\x01');
  ppfStack_3108 = (fdb_kvs_handle **)0x11897f;
  fdb_set(pfStack_30c0,apfStack_30a0[0xf]);
  ppfStack_3108 = (fdb_kvs_handle **)0x118990;
  fdb_set(pfStack_30e8,apfStack_30a0[0x10]);
  ppfStack_3108 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(pfStack_30c8,'\x01');
  ppfStack_3108 = (fdb_kvs_handle **)0x1189af;
  fdb_set(pfStack_30e8,apfStack_30a0[0x11]);
  uVar25 = 0;
  ppfStack_3108 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)auStack_30e0._16_8_,'\0');
  ppfStack_3108 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)auStack_30e0._16_8_);
  ppfStack_3108 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)auStack_30e0._0_8_);
  ppfStack_3108 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(pfStack_30c8);
  ppfStack_3108 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(auStack_30e0 + 0x10),"dummy1",&fStack_2f98);
  ppfStack_3108 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30e0._16_8_,ppfVar14,&fStack_30b8);
  while( true ) {
    ppfStack_3108 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&pfStack_30f0,apfStack_30a0[uVar25 + 10]->key,apfStack_30a0[uVar25 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3108 = (fdb_kvs_handle **)0x118a38;
    fVar5 = fdb_get(pfStack_30e8,pfStack_30f0);
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    ppfStack_3108 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(pfStack_30f0);
    pfStack_30f0 = (fdb_doc *)0x0;
    uVar25 = uVar25 + 1;
    if (uVar25 == 8) {
      ppfStack_3108 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)auStack_30e0,"dummy1",&fStack_2f98);
      ppfStack_3108 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_30e0._0_8_,(fdb_kvs_handle **)(auStack_30e0 + 8),
                 &fStack_30b8);
      ppfStack_3108 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)auStack_30e0._0_8_,'\x02');
      ppfStack_3108 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)auStack_30e0._8_8_,apfStack_30a0[0x14]);
      ppfStack_3108 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)auStack_30e0._16_8_,"dummy2");
      ppfStack_3108 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)auStack_30e0._0_8_,'\x01');
      ppfStack_3108 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)auStack_30e0._16_8_);
      ppfStack_3108 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)auStack_30e0._0_8_);
      lVar24 = 0;
      do {
        ppfStack_3108 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(apfStack_30a0[lVar24]);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0x1e);
      ppfStack_3108 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_3108 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      ppfStack_3108 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar22,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_3108 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_3108 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_3108 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_3108 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_3108 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_19350 = (fdb_doc *)0x118b77;
  ppfStack_3130 = &pfStack_30f0;
  pfStack_3128 = pfVar17;
  ppfStack_3120 = ppfVar10;
  uStack_3118 = uVar25;
  ppfStack_3110 = ppfVar27;
  ppfStack_3108 = ppfVar14;
  gettimeofday(&tStack_192e8,(__timezone_ptr_t)0x0);
  pfStack_19350 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_19338 = (fdb_doc *)0x0;
  pfStack_19350 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_19350 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_19350 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_19070.flags = 1;
  fStack_19070.purging_interval = 0;
  fStack_19070.compaction_threshold = '\0';
  fStack_19070.durability_opt = '\x02';
  pfStack_19350 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_19330,"dummy1",&fStack_19070);
  pfStack_19350 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_19330,&pfStack_19320,&fStack_192d8);
  ppfVar18 = apfStack_18e78;
  pfVar13 = afStack_19278;
  pfVar19 = (fdb_doc *)0x0;
  lVar24 = 0;
  do {
    sVar7 = 0xff7f;
    if (lVar24 == 1) {
      sVar7 = 0x1fff;
    }
    if (lVar24 == 0) {
      sVar7 = 0x7fff;
    }
    pfStack_19350 = (fdb_doc *)0x118c39;
    lStack_19318 = lVar24;
    memset(asStack_130b8,0x5f,sVar7);
    *(undefined1 *)((long)asStack_130b8 + sVar7) = 0;
    lVar24 = 0;
    doc_01 = ppfVar18;
    lStack_19310 = (long)pfVar19;
    ppfStack_19308 = ppfVar18;
    sStack_192f0 = sVar7;
    do {
      pfStack_19350 = (fdb_doc *)0x118c6f;
      lStack_19300 = lVar24;
      sprintf((char *)pfVar13,"%08d");
      asStack_130b8[0] = afStack_19278[0].keylen;
      uVar25 = 0;
      lStack_19328 = (long)pfVar19;
      ppfStack_192f8 = doc_01;
      do {
        pfStack_19350 = (fdb_doc *)0x118cab;
        sprintf((char *)pfVar13,"%08d",uVar25 & 0xffffffff);
        *(size_t *)((long)apfStack_18e78 + sStack_192f0 + 0x5db8) = afStack_19278[0].keylen;
        uVar21 = (int)lStack_19328 + (int)uVar25;
        pfStack_19350 = (fdb_doc *)0x118ce4;
        sprintf(acStack_18f78,"meta%d",(ulong)uVar21);
        pfStack_19350 = (fdb_doc *)0x118cf7;
        sprintf(acStack_19178,"body%d",(ulong)uVar21);
        pfStack_19350 = (fdb_doc *)0x118d04;
        sVar7 = strlen((char *)asStack_130b8);
        pfStack_19350 = (fdb_doc *)0x118d10;
        sVar8 = strlen(acStack_18f78);
        pfStack_19350 = (fdb_doc *)0x118d24;
        sVar12 = strlen(acStack_19178);
        lVar3 = lStack_19328;
        pcVar22 = acStack_19178;
        pfStack_19350 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_01,asStack_130b8,sVar7 + 1,acStack_18f78,sVar8 + 1,pcVar22,sVar12 + 1);
        uVar25 = uVar25 + 1;
        doc_01 = doc_01 + 1;
      } while (uVar25 != 10);
      lVar24 = lStack_19300 + 1;
      doc_01 = ppfStack_192f8 + 10;
      pfVar19 = (fdb_doc *)(lVar3 + 10);
    } while (lVar24 != 100);
    lVar24 = lStack_19318 + 1;
    ppfVar18 = ppfStack_19308 + 1000;
    pfVar19 = (fdb_doc *)(lStack_19310 + 1000);
  } while (lVar24 != 3);
  lVar24 = 0;
  do {
    pfStack_19350 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_19320,apfStack_18e78[lVar24]);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 3000);
  pfStack_19350 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_19330,'\x01');
  pfStack_19350 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_19330,&fStack_192c0);
  if (fStack_192c0.doc_count != 3000) {
    pfStack_19350 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar24 = 0;
  while( true ) {
    pfStack_19350 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_19338,apfStack_18e78[lVar24]->key,apfStack_18e78[lVar24]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_19350 = (fdb_doc *)0x118e52;
    fVar5 = fdb_get(pfStack_19320,pfStack_19338);
    doc = pfStack_19338;
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    doc_01 = (fdb_doc **)pfStack_19338->key;
    pfVar13 = apfStack_18e78[lVar24];
    pcVar22 = (char *)pfVar13->key;
    pfStack_19350 = (fdb_doc *)0x118e7d;
    iVar6 = bcmp(doc_01,pcVar22,pfStack_19338->keylen);
    pfVar19 = doc;
    if (iVar6 != 0) {
      pfStack_19350 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_01 = (fdb_doc **)doc->meta;
    pcVar22 = (char *)pfVar13->meta;
    pfStack_19350 = (fdb_doc *)0x118e9c;
    iVar6 = bcmp(doc_01,pcVar22,doc->metalen);
    if (iVar6 != 0) goto LAB_00118f71;
    doc_01 = (fdb_doc **)doc->body;
    pcVar22 = (char *)pfVar13->body;
    pfStack_19350 = (fdb_doc *)0x118ebb;
    iVar6 = bcmp(doc_01,pcVar22,doc->bodylen);
    if (iVar6 != 0) goto LAB_00118f66;
    pfStack_19350 = (fdb_doc *)0x118ecb;
    fdb_doc_free(doc);
    pfStack_19338 = (fdb_doc *)0x0;
    lVar24 = lVar24 + 1;
    if (lVar24 == 3000) {
      pfStack_19350 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_19330);
      lVar24 = 0;
      do {
        pfStack_19350 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_18e78[lVar24]);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 3000);
      pfStack_19350 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_19350 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_19350 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar22,"long key test");
      return;
    }
  }
  pfStack_19350 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_19350 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_19350 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1d848 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_19378 = &pfStack_19338;
  pcStack_19370 = pcVar22;
  lStack_19368 = lVar24;
  pfStack_19360 = pfVar19;
  ppfStack_19358 = doc_01;
  pfStack_19350 = pfVar13;
  gettimeofday((timeval *)(auStack_1d800 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1d848 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1d848 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1d848 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1d848 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1d678.wal_threshold = 0x400;
  fStack_1d678.compaction_mode = '\0';
  fStack_1d678.durability_opt = '\x02';
  pcVar26 = (char *)&fStack_1d380;
  ppfVar27 = apfStack_1d580;
  pcVar22 = "kvs%d";
  uVar25 = 0;
  ppfVar14 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1d848 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar27,"dummy%d",(ulong)ppfVar14 & 0xffffffff);
    pcVar20 = (char *)(apfStack_1d780 + (long)ppfVar14 + -10);
    pfStack_1d848 = (fdb_kvs_handle *)0x119022;
    fVar5 = fdb_open((fdb_file_handle **)pcVar20,(char *)ppfVar27,&fStack_1d678);
    pfVar16 = (fdb_kvs_handle *)pcVar26;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar4 = (fdb_kvs_handle **)0x0;
    ppfStack_1d828 = ppfVar14;
    pfStack_1d820 = (fdb_kvs_handle *)pcVar26;
    do {
      ppfVar14 = ppfVar4;
      pfStack_1d848 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar27,"kvs%d",(ulong)(uint)((int)ppfVar14 + (int)uVar25));
      pfStack_1d848 = (fdb_kvs_handle *)0x11905b;
      fVar5 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)pcVar20,(fdb_kvs_handle **)pcVar26
                           ,(char *)ppfVar27,&fStack_1d818);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_1d848 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      pcVar26 = (char *)&(((fdb_kvs_handle *)pcVar26)->kvs_config).custom_cmp;
      ppfVar4 = (fdb_kvs_handle **)((long)ppfVar14 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar14 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar14 = (fdb_kvs_handle **)((long)ppfStack_1d828 + 1);
    uVar25 = uVar25 + 0x80;
    pcVar26 = (char *)&pfStack_1d820[1].bub_ctx.space_used;
  } while (ppfVar14 != (fdb_kvs_handle **)0x8);
  ppfVar14 = apfStack_1d780;
  ppfVar27 = apfStack_1d480;
  pfVar16 = (fdb_kvs_handle *)0x0;
  do {
    uVar25 = 0;
    do {
      pfStack_1d848 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar14,"key%08d",uVar25);
      pfStack_1d848 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar27,"value%08d",uVar25);
      pcVar22 = *(char **)(&fStack_1d380.kvs_config.create_if_missing + (long)pfVar16 * 8);
      pfStack_1d848 = (fdb_kvs_handle *)0x1190e0;
      sVar7 = strlen((char *)ppfVar14);
      pcVar20 = (char *)(sVar7 + 1);
      pfStack_1d848 = (fdb_kvs_handle *)0x1190ec;
      sVar7 = strlen((char *)ppfVar27);
      pfStack_1d848 = (fdb_kvs_handle *)0x119101;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)pcVar22,ppfVar14,(size_t)pcVar20,ppfVar27,sVar7 + 1);
      pcVar26 = (char *)pfVar16;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar21 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar21;
    } while (uVar21 != 10);
    pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
  } while (pfVar16 != (fdb_kvs_handle *)0x400);
  pcVar20 = (char *)0x0;
  do {
    if (((ulong)pcVar20 & 1) == 0) {
      pfStack_1d848 = (fdb_kvs_handle *)0x11912f;
      fVar5 = fdb_commit((fdb_file_handle *)apfStack_1d780[(long)pcVar20 + -10],'\0');
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1d848 = (fdb_kvs_handle *)0x119142;
      fVar5 = fdb_commit((fdb_file_handle *)apfStack_1d780[(long)pcVar20 + -10],'\x01');
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while ((fdb_kvs_handle **)pcVar20 != (fdb_kvs_handle **)0x8);
  ppfVar27 = (fdb_kvs_handle **)0xffffffffffffff80;
  pcVar20 = (char *)apfStack_1b380;
  ppfVar14 = (fdb_kvs_handle **)(auStack_1d800 + 8);
  pfVar16 = (fdb_kvs_handle *)auStack_1d800;
  do {
    pfStack_1d848 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1cf80[(long)ppfVar27],(fdb_kvs_info *)pfVar16);
    if ((fdb_custom_cmp_variable)auStack_1d800._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1d848 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1d848 = (fdb_kvs_handle *)0x119199;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1cf80[(long)ppfVar27],
                              (fdb_kvs_handle **)pcVar20,auStack_1d800._8_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar27 = ppfVar27 + 0x10;
    pcVar20 = (char *)((long)pcVar20 + 0x400);
  } while (ppfVar27 < (fdb_kvs_handle **)0x380);
  pcVar20 = (char *)0x0;
  do {
    pfStack_1d848 = (fdb_kvs_handle *)0x1191cf;
    fVar5 = fdb_compact((fdb_file_handle *)apfStack_1d780[(long)pcVar20 - 10],(char *)0x0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while ((fdb_kvs_handle **)pcVar20 != (fdb_kvs_handle **)0x8);
  pcVar20 = (char *)&pfStack_1d830;
  pfStack_1d830 = (fdb_kvs_handle *)0x0;
  ppfVar14 = &pfStack_1d838;
  pcVar26 = "key%08d";
  ppfVar27 = apfStack_1d780;
  pfVar16 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1d848 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_1b380[(long)pfVar16],(fdb_iterator **)ppfVar14,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar25 = 0;
    do {
      pfStack_1d848 = (fdb_kvs_handle *)0x119233;
      fVar5 = fdb_iterator_get((fdb_iterator *)pfStack_1d838,(fdb_doc **)pcVar20);
      pcVar22 = (char *)pfVar16;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1d848 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar27,"key%08d",uVar25);
      pfStack_1d848 = (fdb_kvs_handle *)0x11925b;
      iVar6 = strcmp((char *)ppfVar27,(char *)pfStack_1d830->op_stats);
      if (iVar6 != 0) {
        pfStack_1d848 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar25 = (ulong)((int)uVar25 + 1);
      pfStack_1d848 = (fdb_kvs_handle *)0x11926b;
      fVar5 = fdb_iterator_next((fdb_iterator *)pfStack_1d838);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1d848 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1d838);
    pcVar22 = (char *)&(pfVar16->config).wal_threshold;
    bVar28 = pfVar16 < (fdb_kvs_handle *)0x380;
    pfVar16 = (fdb_kvs_handle *)pcVar22;
  } while (bVar28);
  pfStack_1d848 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1d830);
  pcVar20 = "key%08d";
  ppfVar14 = apfStack_1d780;
  ppfVar27 = (fdb_kvs_handle **)0x0;
  do {
    uVar25 = 0;
    do {
      pfStack_1d848 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar14,"key%08d",uVar25);
      pcVar26 = *(char **)(&fStack_1d380.kvs_config.create_if_missing + (long)ppfVar27 * 8);
      pfStack_1d848 = (fdb_kvs_handle *)0x1192dd;
      sVar7 = strlen((char *)ppfVar14);
      pfStack_1d848 = (fdb_kvs_handle *)0x1192ec;
      fVar5 = fdb_del_kv((fdb_kvs_handle *)pcVar26,ppfVar14,sVar7 + 1);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar21 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar21;
    } while (uVar21 != 10);
    ppfVar27 = (fdb_kvs_handle **)((long)ppfVar27 + 1);
  } while (ppfVar27 != (fdb_kvs_handle **)0x400);
  pcVar20 = "dummy_compact%d";
  ppfVar14 = apfStack_1d580;
  pfVar16 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1d848 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar14,"dummy_compact%d",(ulong)pfVar16 & 0xffffffff);
    pfStack_1d848 = (fdb_kvs_handle *)0x119336;
    fVar5 = fdb_compact((fdb_file_handle *)
                        apfStack_1d780[(long)((long)&pfVar16[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar14);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
  } while (pfVar16 != (fdb_kvs_handle *)0x8);
  pcVar20 = (char *)&pfStack_1d830;
  pfStack_1d830 = (fdb_kvs_handle *)0x0;
  ppfVar14 = &pfStack_1d838;
  pcVar26 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1d848 = (fdb_kvs_handle *)0x11937c;
    fVar5 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1d380.kvs_config.create_if_missing + (long)pcVar26 * 8),
                              (fdb_iterator **)ppfVar14,(void *)0x0,0,(void *)0x0,0,2);
    pfVar16 = (fdb_kvs_handle *)pcVar26;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1d848 = (fdb_kvs_handle *)0x119391;
      fVar5 = fdb_iterator_get((fdb_iterator *)pfStack_1d838,(fdb_doc **)pcVar20);
      if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1d848 = (fdb_kvs_handle *)0x1193a3;
      fVar5 = fdb_iterator_next((fdb_iterator *)pfStack_1d838);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1d848 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1d838);
    pfVar16 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar26)->config).wal_threshold;
    bVar28 = pcVar26 < (fdb_kvs_handle *)0x380;
    pcVar26 = (char *)pfVar16;
  } while (bVar28);
  pfStack_1d848 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1d830);
  pcVar20 = (char *)0x0;
  while( true ) {
    pfStack_1d848 = (fdb_kvs_handle *)0x1193db;
    fVar5 = fdb_close((fdb_file_handle *)apfStack_1d780[(long)pcVar20 - 10]);
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    pcVar20 = (char *)((long)pcVar20 + 1);
    if ((fdb_kvs_handle **)pcVar20 == (fdb_kvs_handle **)0x8) {
      pfStack_1d848 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1d848 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_1d848 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar22,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1d848 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1d848 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1d848 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1dbc0 = (code *)0x119494;
  ppfStack_1d860 = (fdb_kvs_handle **)pcVar20;
  ppfStack_1d858 = ppfVar27;
  ppfStack_1d850 = ppfVar14;
  pfStack_1d848 = pfVar16;
  gettimeofday(&tStack_1db70,(__timezone_ptr_t)0x0);
  pcStack_1dbc0 = (code *)0x119499;
  memleak_start();
  pcStack_1dbc0 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar17 = &fStack_1db60;
  pcStack_1dbc0 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1dbc0 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1dbc0 = (code *)0x1194d0;
  fVar5 = fdb_open(&pfStack_1dba0,"./dummy1",pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcStack_1dbc0 = (code *)0x1194f3;
    fVar5 = fdb_kvs_open(pfStack_1dba0,&pfStack_1db98,"db",&fStack_1db88);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1dbc0 = (code *)0x119516;
    fVar5 = fdb_kvs_open(pfStack_1dba0,&pfStack_1db90,"db2",&fStack_1db88);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar17 = &fStack_1d968;
    pcStack_1dbc0 = (code *)0x119539;
    sprintf((char *)pfVar17,"key%d",0);
    ppfVar14 = apfStack_1da68;
    pcStack_1dbc0 = (code *)0x119554;
    sprintf((char *)ppfVar14,"body%d",0);
    pcStack_1dbc0 = (code *)0x11955c;
    pfVar16 = (fdb_kvs_handle *)strlen((char *)pfVar17);
    pcStack_1dbc0 = (code *)0x119567;
    sVar7 = strlen((char *)ppfVar14);
    ppfVar27 = &pfStack_1dba8;
    pcStack_1dbc0 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar27,pfVar17,(size_t)pfVar16,(void *)0x0,0,ppfVar14,sVar7 + 1);
    pcStack_1dbc0 = (code *)0x119597;
    fVar5 = fdb_set(pfStack_1db98,(fdb_doc *)pfStack_1dba8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1dbc0 = (code *)0x1195ae;
    fVar5 = fdb_commit(pfStack_1dba0,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1dbc0 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1dba8->field_6).seqtree,"bOdy%d",0);
    pcStack_1dbc0 = (code *)0x1195de;
    fVar5 = fdb_set(pfStack_1db90,(fdb_doc *)pfStack_1dba8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1dbc0 = (code *)0x1195f5;
    fVar5 = fdb_commit(pfStack_1dba0,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1dbc0 = (code *)0x11960c;
    fVar5 = fdb_get_metaonly(pfStack_1db98,(fdb_doc *)pfStack_1dba8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1dbc0 = (code *)0x119623;
    fVar5 = fdb_get_metaonly(pfStack_1db90,(fdb_doc *)pfStack_1dba8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1dbc0 = (code *)0x11963a;
    fVar5 = fdb_get_byoffset(pfStack_1db98,(fdb_doc *)pfStack_1dba8);
    if (fVar5 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1dbc0 = (code *)0x11964d;
      fdb_close(pfStack_1dba0);
      pcStack_1dbc0 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1dba8);
      pcStack_1dbc0 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1dbc0 = (code *)0x119661;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pcStack_1dbc0 = (code *)0x119692;
      fprintf(_stderr,pcVar22,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1dbc0 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1dbc0 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1dbc0 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1dbc0 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1dbc0 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1dbc0 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1dbc0 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1dbc0 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1dbc0 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1dbc0 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1dbe8 = pfVar17;
  ppfStack_1dbe0 = ppfVar27;
  pfStack_1dbd8 = (fdb_kvs_handle *)pcVar22;
  ppfStack_1dbd0 = ppfVar14;
  pfStack_1dbc8 = pfVar16;
  pcStack_1dbc0 = (code *)uVar25;
  gettimeofday(&tStack_1dff8,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1dfe8.wal_threshold = 0x400;
  fStack_1dfe8.flags = 1;
  fStack_1dfe8.purging_interval = 0;
  fStack_1dfe8.compaction_threshold = '\0';
  fStack_1dfe8.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1dfe8.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1e050,"./dummy1",&fStack_1dfe8);
  fdb_kvs_open_default(pfStack_1e050,&pfStack_1e058,&fStack_1e010);
  fVar5 = fdb_set_log_callback(pfStack_1e058,logCallbackFunc,"api_wrapper_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    fVar5 = fdb_set_kv(pfStack_1e058,(void *)0x0,0,(void *)0x0,0);
    if (fVar5 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar25 = 0;
    do {
      sprintf(acStack_1ddf0,"key%d",uVar25);
      sprintf(acStack_1dcf0,"body%d",uVar25);
      pfVar16 = pfStack_1e058;
      sVar7 = strlen(acStack_1ddf0);
      sVar8 = strlen(acStack_1dcf0);
      fVar5 = fdb_set_kv(pfVar16,acStack_1ddf0,sVar7,acStack_1dcf0,sVar8);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar21 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar21;
    } while (uVar21 != 10);
    asStack_1e040[1] = 0x726162ffffffff;
    asStack_1e040[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1e028 = 0xbdbdbdbd;
    uStack_1e024 = 0xbdbdbdbd;
    uStack_1e020 = 0xbdbdbdbd;
    uStack_1e01c = 0xbdbdbdbd;
    uStack_1e018 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar5 = fdb_rekey(pfStack_1e050,new_key);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1e058);
    fdb_close(pfStack_1e050);
    fStack_1dfe8.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1dfe8.encryption_key.bytes,"bar",4);
    fStack_1dfe8.encryption_key.bytes[4] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[5] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[6] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[7] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[8] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[9] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[10] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0xb] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0xc] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0xd] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0xe] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0xf] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x10] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x11] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x12] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x13] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x14] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x15] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x16] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x17] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x18] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x19] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1dfe8.encryption_key.bytes[0x1f] = 0xbd;
    fVar5 = fdb_open(&pfStack_1e050,"./dummy1",&fStack_1dfe8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar5 = fdb_kvs_open_default(pfStack_1e050,&pfStack_1e058,&fStack_1e010);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      fVar5 = fdb_set_log_callback(pfStack_1e058,logCallbackFunc,"api_wrapper_test");
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar25 = 0;
      while( true ) {
        sprintf(acStack_1ddf0,"key%d",uVar25);
        pfVar16 = pfStack_1e058;
        sVar7 = strlen(acStack_1ddf0);
        fVar5 = fdb_get_kv(pfVar16,acStack_1ddf0,sVar7,&pvStack_1e048,asStack_1e040);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1def0,"body%d",uVar25);
        ptr = pvStack_1e048;
        iVar6 = bcmp(pvStack_1e048,acStack_1def0,asStack_1e040[0]);
        if (iVar6 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar21 = (int)uVar25 + 1;
        uVar25 = (ulong)uVar21;
        if (uVar21 == 10) {
          fdb_kvs_close(pfStack_1e058);
          fdb_close(pfStack_1e050);
          fdb_shutdown();
          memleak_end();
          pcVar22 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar22 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar22,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
}

Assistant:

void custom_seqnum_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int num_kv = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, num_kv);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc real_doc;
    fdb_doc *rdoc = &real_doc;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], bodybuf[256];
    memset(&real_doc, 0, sizeof(fdb_doc));
    real_doc.key = &keybuf;
    real_doc.body = &bodybuf;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    r = 0;

    fdb_open(&dbfile, "./dummy1", &fconfig);
    if (multi_kv) {
        num_kv = 4;
        for (r = num_kv - 1; r >= 0; --r) {
            char tmp[16];
            sprintf(tmp, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], tmp, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                                          (void *) "custom_seqnum_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    } else {
        num_kv = 1;
        status = fdb_kvs_open_default(dbfile, &db[r], &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                (void *) "custom_seqnum_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (i = 0; i < n/2; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (i = n/2; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            fdb_doc_set_seqnum(doc[i], (i+1)*2); // double seqnum instead of ++
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (r = num_kv - 1; r >= 0; --r) {
        // range scan (before flushing WAL)
        fdb_iterator_init(db[r], &iterator, NULL, 0, NULL, 0, 0x0);
        i = 0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
            ++i;
            if (i <= n/2) {
                TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)i);
            } else {
                TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)i*2);
            }
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    for (i = n/2; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        for (r = num_kv - 1; r >= 0; --r) {
            rdoc->seqnum = (i + 1)*2;
            status = fdb_get_byseq(db[r], rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"Custom sequence number test %s", multi_kv ?
            "multiple kv instances" : "single kv instance");
    TEST_RESULT(bodybuf);
}